

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  undefined4 uVar55;
  undefined8 unaff_RBP;
  ulong uVar56;
  ulong uVar57;
  float fVar58;
  float fVar59;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar87;
  vint4 bi_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar145;
  float fVar161;
  float fVar162;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar163;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar194;
  float fVar195;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar196;
  undefined1 auVar193 [32];
  vfloat4 a0_2;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar219;
  vfloat4 a0_3;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_1;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar239;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  undefined1 auVar241 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar250;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_50c;
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  ulong local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 auStack_348 [16];
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2cc;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 auStack_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar49;
  undefined1 auVar269 [32];
  
  PVar4 = prim[1];
  uVar56 = (ulong)(byte)PVar4;
  fVar58 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  auVar164._0_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar164._4_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar164._8_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar164._12_4_ = fVar58 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar60._0_4_ = fVar58 * auVar12._0_4_;
  auVar60._4_4_ = fVar58 * auVar12._4_4_;
  auVar60._8_4_ = fVar58 * auVar12._8_4_;
  auVar60._12_4_ = fVar58 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xb + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xd + 6)));
  auVar241 = vcvtdq2ps_avx(auVar241);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x12 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x13 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x14 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar258._4_4_ = auVar164._0_4_;
  auVar258._0_4_ = auVar164._0_4_;
  auVar258._8_4_ = auVar164._0_4_;
  auVar258._12_4_ = auVar164._0_4_;
  auVar107 = vshufps_avx(auVar164,auVar164,0x55);
  auVar125 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar58 = auVar125._0_4_;
  auVar220._0_4_ = fVar58 * auVar128._0_4_;
  fVar84 = auVar125._4_4_;
  auVar220._4_4_ = fVar84 * auVar128._4_4_;
  fVar120 = auVar125._8_4_;
  auVar220._8_4_ = fVar120 * auVar128._8_4_;
  fVar85 = auVar125._12_4_;
  auVar220._12_4_ = fVar85 * auVar128._12_4_;
  auVar206._0_4_ = auVar152._0_4_ * fVar58;
  auVar206._4_4_ = auVar152._4_4_ * fVar84;
  auVar206._8_4_ = auVar152._8_4_ * fVar120;
  auVar206._12_4_ = auVar152._12_4_ * fVar85;
  auVar197._0_4_ = auVar89._0_4_ * fVar58;
  auVar197._4_4_ = auVar89._4_4_ * fVar84;
  auVar197._8_4_ = auVar89._8_4_ * fVar120;
  auVar197._12_4_ = auVar89._12_4_ * fVar85;
  auVar125 = vfmadd231ps_fma(auVar220,auVar107,auVar12);
  auVar90 = vfmadd231ps_fma(auVar206,auVar107,auVar241);
  auVar107 = vfmadd231ps_fma(auVar197,auVar234,auVar107);
  auVar121 = vfmadd231ps_fma(auVar125,auVar258,auVar10);
  auVar90 = vfmadd231ps_fma(auVar90,auVar258,auVar11);
  auVar134 = vfmadd231ps_fma(auVar107,auVar61,auVar258);
  auVar259._4_4_ = auVar60._0_4_;
  auVar259._0_4_ = auVar60._0_4_;
  auVar259._8_4_ = auVar60._0_4_;
  auVar259._12_4_ = auVar60._0_4_;
  auVar107 = vshufps_avx(auVar60,auVar60,0x55);
  auVar125 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar58 = auVar125._0_4_;
  auVar165._0_4_ = fVar58 * auVar128._0_4_;
  fVar84 = auVar125._4_4_;
  auVar165._4_4_ = fVar84 * auVar128._4_4_;
  fVar120 = auVar125._8_4_;
  auVar165._8_4_ = fVar120 * auVar128._8_4_;
  fVar85 = auVar125._12_4_;
  auVar165._12_4_ = fVar85 * auVar128._12_4_;
  auVar88._0_4_ = auVar152._0_4_ * fVar58;
  auVar88._4_4_ = auVar152._4_4_ * fVar84;
  auVar88._8_4_ = auVar152._8_4_ * fVar120;
  auVar88._12_4_ = auVar152._12_4_ * fVar85;
  auVar125._0_4_ = auVar89._0_4_ * fVar58;
  auVar125._4_4_ = auVar89._4_4_ * fVar84;
  auVar125._8_4_ = auVar89._8_4_ * fVar120;
  auVar125._12_4_ = auVar89._12_4_ * fVar85;
  auVar12 = vfmadd231ps_fma(auVar165,auVar107,auVar12);
  auVar128 = vfmadd231ps_fma(auVar88,auVar107,auVar241);
  auVar241 = vfmadd231ps_fma(auVar125,auVar107,auVar234);
  auVar234 = vfmadd231ps_fma(auVar12,auVar259,auVar10);
  auVar89 = vfmadd231ps_fma(auVar128,auVar259,auVar11);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar121,local_318);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar181,1);
  auVar12 = vblendvps_avx(auVar121,auVar181,auVar10);
  auVar10 = vandps_avx(auVar90,local_318);
  auVar10 = vcmpps_avx(auVar10,auVar181,1);
  auVar128 = vblendvps_avx(auVar90,auVar181,auVar10);
  auVar10 = vandps_avx(auVar134,local_318);
  auVar10 = vcmpps_avx(auVar10,auVar181,1);
  auVar10 = vblendvps_avx(auVar134,auVar181,auVar10);
  auVar107 = vfmadd231ps_fma(auVar241,auVar259,auVar61);
  auVar11 = vrcpps_avx(auVar12);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = 0x3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar11,auVar182);
  auVar11 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar12 = vrcpps_avx(auVar128);
  auVar128 = vfnmadd213ps_fma(auVar128,auVar12,auVar182);
  auVar152 = vfmadd132ps_fma(auVar128,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar182);
  auVar61 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar10 = vpmovsxwd_avx(auVar10);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar234);
  auVar134._0_4_ = auVar11._0_4_ * auVar10._0_4_;
  auVar134._4_4_ = auVar11._4_4_ * auVar10._4_4_;
  auVar134._8_4_ = auVar11._8_4_ * auVar10._8_4_;
  auVar134._12_4_ = auVar11._12_4_ * auVar10._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar10 = vpmovsxwd_avx(auVar12);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar234);
  auVar146._0_4_ = auVar11._0_4_ * auVar10._0_4_;
  auVar146._4_4_ = auVar11._4_4_ * auVar10._4_4_;
  auVar146._8_4_ = auVar11._8_4_ * auVar10._8_4_;
  auVar146._12_4_ = auVar11._12_4_ * auVar10._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar56 * 0xe + 6);
  auVar10 = vpmovsxwd_avx(auVar128);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar89);
  auVar166._0_4_ = auVar152._0_4_ * auVar10._0_4_;
  auVar166._4_4_ = auVar152._4_4_ * auVar10._4_4_;
  auVar166._8_4_ = auVar152._8_4_ * auVar10._8_4_;
  auVar166._12_4_ = auVar152._12_4_ * auVar10._12_4_;
  auVar90._1_3_ = 0;
  auVar90[0] = PVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar12 = vsubps_avx(auVar10,auVar89);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar56 * 0x15 + 6);
  auVar10 = vpmovsxwd_avx(auVar241);
  auVar89._0_4_ = auVar152._0_4_ * auVar12._0_4_;
  auVar89._4_4_ = auVar152._4_4_ * auVar12._4_4_;
  auVar89._8_4_ = auVar152._8_4_ * auVar12._8_4_;
  auVar89._12_4_ = auVar152._12_4_ * auVar12._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar107);
  auVar121._0_4_ = auVar61._0_4_ * auVar10._0_4_;
  auVar121._4_4_ = auVar61._4_4_ * auVar10._4_4_;
  auVar121._8_4_ = auVar61._8_4_ * auVar10._8_4_;
  auVar121._12_4_ = auVar61._12_4_ * auVar10._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar56 * 0x17 + 6);
  auVar10 = vpmovsxwd_avx(auVar152);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar107);
  auVar234._0_4_ = auVar61._0_4_ * auVar10._0_4_;
  auVar234._4_4_ = auVar61._4_4_ * auVar10._4_4_;
  auVar234._8_4_ = auVar61._8_4_ * auVar10._8_4_;
  auVar234._12_4_ = auVar61._12_4_ * auVar10._12_4_;
  auVar10 = vpminsd_avx(auVar134,auVar146);
  auVar12 = vpminsd_avx(auVar166,auVar89);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vpminsd_avx(auVar121,auVar234);
  uVar55 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar207._4_4_ = uVar55;
  auVar207._0_4_ = uVar55;
  auVar207._8_4_ = uVar55;
  auVar207._12_4_ = uVar55;
  auVar12 = vmaxps_avx(auVar12,auVar207);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  local_288._0_4_ = auVar10._0_4_ * 0.99999964;
  local_288._4_4_ = auVar10._4_4_ * 0.99999964;
  local_288._8_4_ = auVar10._8_4_ * 0.99999964;
  local_288._12_4_ = auVar10._12_4_ * 0.99999964;
  auVar10 = vpmaxsd_avx(auVar134,auVar146);
  auVar12 = vpmaxsd_avx(auVar166,auVar89);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar12 = vpmaxsd_avx(auVar121,auVar234);
  fVar58 = (ray->super_RayK<1>).tfar;
  auVar107._4_4_ = fVar58;
  auVar107._0_4_ = fVar58;
  auVar107._8_4_ = fVar58;
  auVar107._12_4_ = fVar58;
  auVar12 = vminps_avx(auVar12,auVar107);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar61._0_4_ = auVar10._0_4_ * 1.0000004;
  auVar61._4_4_ = auVar10._4_4_ * 1.0000004;
  auVar61._8_4_ = auVar10._8_4_ * 1.0000004;
  auVar61._12_4_ = auVar10._12_4_ * 1.0000004;
  auVar90[4] = PVar4;
  auVar90._5_3_ = 0;
  auVar90[8] = PVar4;
  auVar90._9_3_ = 0;
  auVar90[0xc] = PVar4;
  auVar90._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar90,_DAT_01f4ad30);
  auVar10 = vcmpps_avx(local_288,auVar61,2);
  auVar10 = vandps_avx(auVar10,auVar12);
  uVar55 = vmovmskps_avx(auVar10);
  uVar56 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar55);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
LAB_01180fd7:
  if (uVar56 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar54 = uVar56; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar48].ptr;
  local_4b0 = (ulong)*(uint *)(prim + lVar50 * 4 + 6);
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar50 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar10 = *(undefined1 (*) [16])(_Var8 + uVar54 * (long)pvVar7);
  auVar12 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 1) * (long)pvVar7);
  auVar128 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar54 + 3));
  fVar58 = *pfVar1;
  fVar84 = pfVar1[1];
  fVar120 = pfVar1[2];
  fVar85 = pfVar1[3];
  lVar50 = *(long *)&pGVar5[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar54);
  auVar241 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar54 + 1));
  auVar152 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar54 + 2));
  uVar56 = uVar56 - 1 & uVar56;
  pfVar1 = (float *)(lVar50 + (long)p_Var6 * (uVar54 + 3));
  fVar86 = *pfVar1;
  fVar59 = pfVar1[1];
  fVar145 = pfVar1[2];
  fVar219 = pfVar1[3];
  if (uVar56 != 0) {
    uVar57 = uVar56 - 1 & uVar56;
    for (uVar54 = uVar56; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar57 != 0) {
      for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  auVar108._0_4_ = fVar86 * -0.0;
  auVar108._4_4_ = fVar59 * -0.0;
  auVar108._8_4_ = fVar145 * -0.0;
  auVar108._12_4_ = fVar219 * -0.0;
  auVar61 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar152,auVar108);
  auVar62._0_4_ = auVar241._0_4_ + auVar61._0_4_;
  auVar62._4_4_ = auVar241._4_4_ + auVar61._4_4_;
  auVar62._8_4_ = auVar241._8_4_ + auVar61._8_4_;
  auVar62._12_4_ = auVar241._12_4_ + auVar61._12_4_;
  auVar234 = vfmadd231ps_fma(auVar62,auVar11,auVar91);
  auVar121 = ZEXT816(0) << 0x40;
  auVar92._0_4_ = fVar86 * 0.0;
  auVar92._4_4_ = fVar59 * 0.0;
  auVar92._8_4_ = fVar145 * 0.0;
  auVar92._12_4_ = fVar219 * 0.0;
  auVar265._8_4_ = 0x3f000000;
  auVar265._0_8_ = 0x3f0000003f000000;
  auVar265._12_4_ = 0x3f000000;
  auVar61 = vfmadd231ps_fma(auVar92,auVar152,auVar265);
  auVar61 = vfmadd231ps_fma(auVar61,auVar241,auVar121);
  auVar125 = vfnmadd231ps_fma(auVar61,auVar11,auVar265);
  auVar251._0_4_ = fVar58 * -0.0;
  auVar251._4_4_ = fVar84 * -0.0;
  auVar251._8_4_ = fVar120 * -0.0;
  auVar251._12_4_ = fVar85 * -0.0;
  auVar61 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar128,auVar251);
  auVar240._0_4_ = auVar61._0_4_ + auVar12._0_4_;
  auVar240._4_4_ = auVar61._4_4_ + auVar12._4_4_;
  auVar240._8_4_ = auVar61._8_4_ + auVar12._8_4_;
  auVar240._12_4_ = auVar61._12_4_ + auVar12._12_4_;
  auVar61 = vfmadd231ps_fma(auVar240,auVar10,auVar91);
  auVar232._0_4_ = fVar58 * 0.0;
  auVar232._4_4_ = fVar84 * 0.0;
  auVar232._8_4_ = fVar120 * 0.0;
  auVar232._12_4_ = fVar85 * 0.0;
  auVar89 = vfmadd231ps_fma(auVar232,auVar128,auVar265);
  auVar89 = vfmadd231ps_fma(auVar89,auVar12,auVar121);
  auVar90 = vfnmadd231ps_fma(auVar89,auVar10,auVar265);
  auVar109._0_4_ = auVar152._0_4_ + auVar108._0_4_;
  auVar109._4_4_ = auVar152._4_4_ + auVar108._4_4_;
  auVar109._8_4_ = auVar152._8_4_ + auVar108._8_4_;
  auVar109._12_4_ = auVar152._12_4_ + auVar108._12_4_;
  auVar89 = vfmadd231ps_fma(auVar109,auVar241,auVar121);
  auVar89 = vfmadd231ps_fma(auVar89,auVar11,auVar91);
  auVar122._0_4_ = fVar86 * 0.5;
  auVar122._4_4_ = fVar59 * 0.5;
  auVar122._8_4_ = fVar145 * 0.5;
  auVar122._12_4_ = fVar219 * 0.5;
  auVar152 = vfmadd231ps_fma(auVar122,auVar121,auVar152);
  auVar241 = vfnmadd231ps_fma(auVar152,auVar265,auVar241);
  auVar107 = vfmadd231ps_fma(auVar241,auVar121,auVar11);
  auVar198._0_4_ = auVar251._0_4_ + auVar128._0_4_;
  auVar198._4_4_ = auVar251._4_4_ + auVar128._4_4_;
  auVar198._8_4_ = auVar251._8_4_ + auVar128._8_4_;
  auVar198._12_4_ = auVar251._12_4_ + auVar128._12_4_;
  auVar11 = vfmadd231ps_fma(auVar198,auVar12,auVar121);
  auVar241 = vfmadd231ps_fma(auVar11,auVar10,auVar91);
  auVar208._0_4_ = fVar58 * 0.5;
  auVar208._4_4_ = fVar84 * 0.5;
  auVar208._8_4_ = fVar120 * 0.5;
  auVar208._12_4_ = fVar85 * 0.5;
  auVar128 = vfmadd231ps_fma(auVar208,auVar121,auVar128);
  auVar12 = vfnmadd231ps_fma(auVar128,auVar265,auVar12);
  auVar152 = vfmadd231ps_fma(auVar12,auVar121,auVar10);
  auVar10 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar12 = vshufps_avx(auVar61,auVar61,0xc9);
  fVar86 = auVar125._0_4_;
  auVar147._0_4_ = fVar86 * auVar12._0_4_;
  fVar59 = auVar125._4_4_;
  auVar147._4_4_ = fVar59 * auVar12._4_4_;
  fVar145 = auVar125._8_4_;
  auVar147._8_4_ = fVar145 * auVar12._8_4_;
  fVar219 = auVar125._12_4_;
  auVar147._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar147,auVar10,auVar61);
  auVar128 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar148._0_4_ = fVar86 * auVar12._0_4_;
  auVar148._4_4_ = fVar59 * auVar12._4_4_;
  auVar148._8_4_ = fVar145 * auVar12._8_4_;
  auVar148._12_4_ = fVar219 * auVar12._12_4_;
  auVar10 = vfmsub231ps_fma(auVar148,auVar10,auVar90);
  auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar12 = vshufps_avx(auVar241,auVar241,0xc9);
  fVar180 = auVar107._0_4_;
  auVar135._0_4_ = fVar180 * auVar12._0_4_;
  fVar194 = auVar107._4_4_;
  auVar135._4_4_ = fVar194 * auVar12._4_4_;
  fVar195 = auVar107._8_4_;
  auVar135._8_4_ = fVar195 * auVar12._8_4_;
  fVar196 = auVar107._12_4_;
  auVar135._12_4_ = fVar196 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar135,auVar10,auVar241);
  auVar241 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar152,auVar152,0xc9);
  auVar167._0_4_ = fVar180 * auVar12._0_4_;
  auVar167._4_4_ = fVar194 * auVar12._4_4_;
  auVar167._8_4_ = fVar195 * auVar12._8_4_;
  auVar167._12_4_ = fVar196 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar167,auVar10,auVar152);
  auVar10 = vdpps_avx(auVar128,auVar128,0x7f);
  auVar152 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar84 = auVar10._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar84;
  auVar12 = vrsqrtss_avx(auVar209,auVar209);
  fVar58 = auVar12._0_4_;
  auVar12 = vdpps_avx(auVar128,auVar11,0x7f);
  fVar58 = fVar58 * 1.5 + fVar84 * -0.5 * fVar58 * fVar58 * fVar58;
  fVar144 = fVar58 * auVar128._0_4_;
  fVar161 = fVar58 * auVar128._4_4_;
  fVar162 = fVar58 * auVar128._8_4_;
  fVar163 = fVar58 * auVar128._12_4_;
  auVar221._0_4_ = auVar11._0_4_ * fVar84;
  auVar221._4_4_ = auVar11._4_4_ * fVar84;
  auVar221._8_4_ = auVar11._8_4_ * fVar84;
  auVar221._12_4_ = auVar11._12_4_ * fVar84;
  fVar84 = auVar12._0_4_;
  auVar183._0_4_ = fVar84 * auVar128._0_4_;
  auVar183._4_4_ = fVar84 * auVar128._4_4_;
  auVar183._8_4_ = fVar84 * auVar128._8_4_;
  auVar183._12_4_ = fVar84 * auVar128._12_4_;
  auVar128 = vsubps_avx(auVar221,auVar183);
  auVar12 = vrcpss_avx(auVar209,auVar209);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar120 = auVar12._0_4_ * auVar10._0_4_;
  auVar10 = vdpps_avx(auVar241,auVar241,0x7f);
  fVar85 = auVar10._0_4_;
  auVar199._4_12_ = ZEXT812(0) << 0x20;
  auVar199._0_4_ = fVar85;
  auVar12 = vrsqrtss_avx(auVar199,auVar199);
  fVar84 = auVar12._0_4_;
  fVar84 = fVar84 * 1.5 + fVar85 * -0.5 * fVar84 * fVar84 * fVar84;
  fVar239 = fVar84 * auVar241._0_4_;
  fVar248 = fVar84 * auVar241._4_4_;
  fVar249 = fVar84 * auVar241._8_4_;
  fVar250 = fVar84 * auVar241._12_4_;
  auVar12 = vdpps_avx(auVar241,auVar152,0x7f);
  auVar168._0_4_ = fVar85 * auVar152._0_4_;
  auVar168._4_4_ = fVar85 * auVar152._4_4_;
  auVar168._8_4_ = fVar85 * auVar152._8_4_;
  auVar168._12_4_ = fVar85 * auVar152._12_4_;
  fVar85 = auVar12._0_4_;
  auVar136._0_4_ = fVar85 * auVar241._0_4_;
  auVar136._4_4_ = fVar85 * auVar241._4_4_;
  auVar136._8_4_ = fVar85 * auVar241._8_4_;
  auVar136._12_4_ = fVar85 * auVar241._12_4_;
  auVar11 = vsubps_avx(auVar168,auVar136);
  auVar12 = vrcpss_avx(auVar199,auVar199);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar85 = auVar10._0_4_ * auVar12._0_4_;
  auVar10 = vshufps_avx(auVar234,auVar234,0xff);
  auVar200._0_4_ = auVar10._0_4_ * fVar144;
  auVar200._4_4_ = auVar10._4_4_ * fVar161;
  auVar200._8_4_ = auVar10._8_4_ * fVar162;
  auVar200._12_4_ = auVar10._12_4_ * fVar163;
  local_438 = vsubps_avx(auVar234,auVar200);
  auVar12 = vshufps_avx(auVar125,auVar125,0xff);
  auVar149._0_4_ = auVar12._0_4_ * fVar144 + auVar10._0_4_ * fVar58 * fVar120 * auVar128._0_4_;
  auVar149._4_4_ = auVar12._4_4_ * fVar161 + auVar10._4_4_ * fVar58 * fVar120 * auVar128._4_4_;
  auVar149._8_4_ = auVar12._8_4_ * fVar162 + auVar10._8_4_ * fVar58 * fVar120 * auVar128._8_4_;
  auVar149._12_4_ = auVar12._12_4_ * fVar163 + auVar10._12_4_ * fVar58 * fVar120 * auVar128._12_4_;
  auVar128 = vsubps_avx(auVar125,auVar149);
  local_448._0_4_ = auVar200._0_4_ + auVar234._0_4_;
  local_448._4_4_ = auVar200._4_4_ + auVar234._4_4_;
  fStack_440 = auVar200._8_4_ + auVar234._8_4_;
  fStack_43c = auVar200._12_4_ + auVar234._12_4_;
  auVar10 = vshufps_avx(auVar89,auVar89,0xff);
  auVar93._0_4_ = fVar239 * auVar10._0_4_;
  auVar93._4_4_ = fVar248 * auVar10._4_4_;
  auVar93._8_4_ = fVar249 * auVar10._8_4_;
  auVar93._12_4_ = fVar250 * auVar10._12_4_;
  local_458 = vsubps_avx(auVar89,auVar93);
  auVar12 = vshufps_avx(auVar107,auVar107,0xff);
  auVar63._0_4_ = fVar239 * auVar12._0_4_ + auVar10._0_4_ * fVar84 * auVar11._0_4_ * fVar85;
  auVar63._4_4_ = fVar248 * auVar12._4_4_ + auVar10._4_4_ * fVar84 * auVar11._4_4_ * fVar85;
  auVar63._8_4_ = fVar249 * auVar12._8_4_ + auVar10._8_4_ * fVar84 * auVar11._8_4_ * fVar85;
  auVar63._12_4_ = fVar250 * auVar12._12_4_ + auVar10._12_4_ * fVar84 * auVar11._12_4_ * fVar85;
  auVar10 = vsubps_avx(auVar107,auVar63);
  local_4a8 = auVar89._0_4_ + auVar93._0_4_;
  fStack_4a4 = auVar89._4_4_ + auVar93._4_4_;
  fStack_4a0 = auVar89._8_4_ + auVar93._8_4_;
  fStack_49c = auVar89._12_4_ + auVar93._12_4_;
  local_468._0_4_ = local_438._0_4_ + auVar128._0_4_ * 0.33333334;
  local_468._4_4_ = local_438._4_4_ + auVar128._4_4_ * 0.33333334;
  local_468._8_4_ = local_438._8_4_ + auVar128._8_4_ * 0.33333334;
  local_468._12_4_ = local_438._12_4_ + auVar128._12_4_ * 0.33333334;
  auVar64._0_4_ = auVar10._0_4_ * 0.33333334;
  auVar64._4_4_ = auVar10._4_4_ * 0.33333334;
  auVar64._8_4_ = auVar10._8_4_ * 0.33333334;
  auVar64._12_4_ = auVar10._12_4_ * 0.33333334;
  local_478 = vsubps_avx(local_458,auVar64);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar128 = vsubps_avx(local_438,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar128,auVar128,0x55);
  auVar12 = vshufps_avx(auVar128,auVar128,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar58 = (pre->ray_space).vz.field_0.m128[0];
  fVar84 = (pre->ray_space).vz.field_0.m128[1];
  fVar120 = (pre->ray_space).vz.field_0.m128[2];
  fVar85 = (pre->ray_space).vz.field_0.m128[3];
  auVar137._0_4_ = fVar58 * auVar12._0_4_;
  auVar137._4_4_ = fVar84 * auVar12._4_4_;
  auVar137._8_4_ = fVar120 * auVar12._8_4_;
  auVar137._12_4_ = fVar85 * auVar12._12_4_;
  auVar107 = vfmadd231ps_fma(auVar137,(undefined1  [16])aVar3,auVar10);
  auVar11 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar11,auVar11,0x55);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar65._0_4_ = fVar58 * auVar12._0_4_;
  auVar65._4_4_ = fVar84 * auVar12._4_4_;
  auVar65._8_4_ = fVar120 * auVar12._8_4_;
  auVar65._12_4_ = fVar85 * auVar12._12_4_;
  auVar125 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar10);
  auVar12 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar110._0_4_ = fVar58 * auVar10._0_4_;
  auVar110._4_4_ = fVar84 * auVar10._4_4_;
  auVar110._8_4_ = fVar120 * auVar10._8_4_;
  auVar110._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar12,auVar12,0x55);
  auVar90 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar3,auVar10);
  auVar241 = vsubps_avx(local_458,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar123._0_4_ = fVar58 * auVar10._0_4_;
  auVar123._4_4_ = fVar84 * auVar10._4_4_;
  auVar123._8_4_ = fVar120 * auVar10._8_4_;
  auVar123._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar241,auVar241,0x55);
  auVar121 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar10);
  auVar152 = vsubps_avx(_local_448,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar152,auVar152,0xaa);
  auVar94._0_4_ = fVar58 * auVar10._0_4_;
  auVar94._4_4_ = fVar84 * auVar10._4_4_;
  auVar94._8_4_ = fVar120 * auVar10._8_4_;
  auVar94._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar152,auVar152,0x55);
  auVar134 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar10);
  local_488._0_4_ = (fVar86 + auVar149._0_4_) * 0.33333334 + (float)local_448._0_4_;
  local_488._4_4_ = (fVar59 + auVar149._4_4_) * 0.33333334 + (float)local_448._4_4_;
  fStack_480 = (fVar145 + auVar149._8_4_) * 0.33333334 + fStack_440;
  fStack_47c = (fVar219 + auVar149._12_4_) * 0.33333334 + fStack_43c;
  auVar61 = vsubps_avx(_local_488,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar233._0_4_ = fVar58 * auVar10._0_4_;
  auVar233._4_4_ = fVar84 * auVar10._4_4_;
  auVar233._8_4_ = fVar120 * auVar10._8_4_;
  auVar233._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar61,auVar61,0x55);
  auVar60 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar3,auVar10);
  auVar222._0_4_ = (fVar180 + auVar63._0_4_) * 0.33333334;
  auVar222._4_4_ = (fVar194 + auVar63._4_4_) * 0.33333334;
  auVar222._8_4_ = (fVar195 + auVar63._8_4_) * 0.33333334;
  auVar222._12_4_ = (fVar196 + auVar63._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4a4;
  auVar42._0_4_ = local_4a8;
  auVar42._8_4_ = fStack_4a0;
  auVar42._12_4_ = fStack_49c;
  _local_498 = vsubps_avx(auVar42,auVar222);
  auVar234 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar234,auVar234,0xaa);
  auVar223._0_4_ = fVar58 * auVar10._0_4_;
  auVar223._4_4_ = fVar84 * auVar10._4_4_;
  auVar223._8_4_ = fVar120 * auVar10._8_4_;
  auVar223._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar234,auVar234,0x55);
  auVar88 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar3,auVar10);
  auVar89 = vsubps_avx(auVar42,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar89,auVar89,0xaa);
  auVar184._0_4_ = fVar58 * auVar10._0_4_;
  auVar184._4_4_ = fVar84 * auVar10._4_4_;
  auVar184._8_4_ = fVar120 * auVar10._8_4_;
  auVar184._12_4_ = fVar85 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar89,auVar89,0x55);
  auVar10 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar3,auVar10);
  local_508._0_4_ = auVar128._0_4_;
  auVar169._4_4_ = local_508._0_4_;
  auVar169._0_4_ = local_508._0_4_;
  auVar169._8_4_ = local_508._0_4_;
  auVar169._12_4_ = local_508._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar107 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar3,auVar169);
  local_4c8._0_4_ = auVar11._0_4_;
  auVar170._4_4_ = local_4c8._0_4_;
  auVar170._0_4_ = local_4c8._0_4_;
  auVar170._8_4_ = local_4c8._0_4_;
  auVar170._12_4_ = local_4c8._0_4_;
  auVar11 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar3,auVar170);
  uVar55 = auVar12._0_4_;
  auVar171._4_4_ = uVar55;
  auVar171._0_4_ = uVar55;
  auVar171._8_4_ = uVar55;
  auVar171._12_4_ = uVar55;
  auVar125 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar171);
  uVar55 = auVar241._0_4_;
  auVar172._4_4_ = uVar55;
  auVar172._0_4_ = uVar55;
  auVar172._8_4_ = uVar55;
  auVar172._12_4_ = uVar55;
  auVar241 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar3,auVar172);
  uVar55 = auVar152._0_4_;
  auVar173._4_4_ = uVar55;
  auVar173._0_4_ = uVar55;
  auVar173._8_4_ = uVar55;
  auVar173._12_4_ = uVar55;
  auVar152 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar3,auVar173);
  uVar55 = auVar61._0_4_;
  auVar174._4_4_ = uVar55;
  auVar174._0_4_ = uVar55;
  auVar174._8_4_ = uVar55;
  auVar174._12_4_ = uVar55;
  auVar61 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar3,auVar174);
  uVar55 = auVar234._0_4_;
  auVar66._4_4_ = uVar55;
  auVar66._0_4_ = uVar55;
  auVar66._8_4_ = uVar55;
  auVar66._12_4_ = uVar55;
  auVar234 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar3,auVar66);
  uVar55 = auVar89._0_4_;
  auVar67._4_4_ = uVar55;
  auVar67._0_4_ = uVar55;
  auVar67._8_4_ = uVar55;
  auVar67._12_4_ = uVar55;
  auVar89 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar67);
  local_4c8 = vmovlhps_avx(auVar107,auVar152);
  local_4d8 = vmovlhps_avx(auVar11,auVar61);
  local_4e8 = vmovlhps_avx(auVar125,auVar234);
  _local_218 = vmovlhps_avx(auVar241,auVar89);
  auVar10 = vminps_avx(local_4c8,local_4d8);
  auVar12 = vminps_avx(local_4e8,_local_218);
  auVar128 = vminps_avx(auVar10,auVar12);
  auVar10 = vmaxps_avx(local_4c8,local_4d8);
  auVar12 = vmaxps_avx(local_4e8,_local_218);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vshufpd_avx(auVar128,auVar128,3);
  auVar128 = vminps_avx(auVar128,auVar12);
  auVar12 = vshufpd_avx(auVar10,auVar10,3);
  auVar12 = vmaxps_avx(auVar10,auVar12);
  auVar10 = vandps_avx(local_318,auVar128);
  auVar12 = vandps_avx(local_318,auVar12);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vmovshdup_avx(auVar10);
  auVar10 = vmaxss_avx(auVar12,auVar10);
  local_78 = auVar10._0_4_ * 9.536743e-07;
  local_3b8._0_8_ = auVar107._0_8_;
  local_3b8._8_8_ = local_3b8._0_8_;
  local_3c8._0_8_ = auVar11._0_8_;
  local_3c8._8_8_ = local_3c8._0_8_;
  local_3d8._8_8_ = auVar125._0_8_;
  local_3d8._0_8_ = auVar125._0_8_;
  local_3e8._8_8_ = auVar241._0_8_;
  local_3e8._0_8_ = auVar241._0_8_;
  register0x00001388 = auVar152._0_8_;
  local_3f8 = auVar152._0_8_;
  local_408 = auVar61._0_8_;
  register0x000014c8 = local_408;
  local_418 = auVar234._0_8_;
  register0x00001488 = local_418;
  register0x000012c8 = auVar89._0_8_;
  local_428 = auVar89._0_8_;
  local_228 = ZEXT416((uint)local_78);
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar54 = 0;
  local_1e8 = vsubps_avx(local_4d8,local_4c8);
  local_1f8 = vsubps_avx(local_4e8,local_4d8);
  local_208 = vsubps_avx(_local_218,local_4e8);
  local_248 = vsubps_avx(_local_448,local_438);
  local_258 = vsubps_avx(_local_488,local_468);
  local_268 = vsubps_avx(_local_498,local_478);
  auVar43._4_4_ = fStack_4a4;
  auVar43._0_4_ = local_4a8;
  auVar43._8_4_ = fStack_4a0;
  auVar43._12_4_ = fStack_49c;
  _local_278 = vsubps_avx(auVar43,local_458);
  auVar68 = ZEXT816(0x3f80000000000000);
  local_238 = auVar68;
LAB_01181713:
  auVar10 = vshufps_avx(auVar68,auVar68,0x50);
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar269._16_4_ = 0x3f800000;
  auVar269._0_16_ = auVar266;
  auVar269._20_4_ = 0x3f800000;
  auVar269._24_4_ = 0x3f800000;
  auVar269._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar266,auVar10);
  fVar58 = auVar10._0_4_;
  auVar69._0_4_ = local_3f8._0_4_ * fVar58;
  fVar84 = auVar10._4_4_;
  auVar69._4_4_ = local_3f8._4_4_ * fVar84;
  fVar120 = auVar10._8_4_;
  auVar69._8_4_ = local_3f8._8_4_ * fVar120;
  fVar85 = auVar10._12_4_;
  auVar69._12_4_ = local_3f8._12_4_ * fVar85;
  auVar175._0_4_ = local_408._0_4_ * fVar58;
  auVar175._4_4_ = local_408._4_4_ * fVar84;
  auVar175._8_4_ = local_408._8_4_ * fVar120;
  auVar175._12_4_ = local_408._12_4_ * fVar85;
  auVar138._0_4_ = local_418._0_4_ * fVar58;
  auVar138._4_4_ = local_418._4_4_ * fVar84;
  auVar138._8_4_ = local_418._8_4_ * fVar120;
  auVar138._12_4_ = local_418._12_4_ * fVar85;
  auVar111._0_4_ = local_428._0_4_ * fVar58;
  auVar111._4_4_ = local_428._4_4_ * fVar84;
  auVar111._8_4_ = local_428._8_4_ * fVar120;
  auVar111._12_4_ = local_428._12_4_ * fVar85;
  auVar241 = vfmadd231ps_fma(auVar69,auVar12,local_3b8);
  auVar152 = vfmadd231ps_fma(auVar175,auVar12,local_3c8);
  auVar61 = vfmadd231ps_fma(auVar138,auVar12,local_3d8);
  auVar234 = vfmadd231ps_fma(auVar111,local_3e8,auVar12);
  auVar10 = vmovshdup_avx(local_238);
  fVar58 = local_238._0_4_;
  fStack_140 = (auVar10._0_4_ - fVar58) * 0.04761905;
  auVar217._4_4_ = fVar58;
  auVar217._0_4_ = fVar58;
  auVar217._8_4_ = fVar58;
  auVar217._12_4_ = fVar58;
  auVar217._16_4_ = fVar58;
  auVar217._20_4_ = fVar58;
  auVar217._24_4_ = fVar58;
  auVar217._28_4_ = fVar58;
  auVar104._0_8_ = auVar10._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  auVar81 = vsubps_avx(auVar104,auVar217);
  uVar55 = auVar241._0_4_;
  auVar263._4_4_ = uVar55;
  auVar263._0_4_ = uVar55;
  auVar263._8_4_ = uVar55;
  auVar263._12_4_ = uVar55;
  auVar263._16_4_ = uVar55;
  auVar263._20_4_ = uVar55;
  auVar263._24_4_ = uVar55;
  auVar263._28_4_ = uVar55;
  auVar10 = vmovshdup_avx(auVar241);
  uVar87 = auVar10._0_8_;
  auVar257._8_8_ = uVar87;
  auVar257._0_8_ = uVar87;
  auVar257._16_8_ = uVar87;
  auVar257._24_8_ = uVar87;
  fVar180 = auVar152._0_4_;
  auVar245._4_4_ = fVar180;
  auVar245._0_4_ = fVar180;
  auVar245._8_4_ = fVar180;
  auVar245._12_4_ = fVar180;
  auVar245._16_4_ = fVar180;
  auVar245._20_4_ = fVar180;
  auVar245._24_4_ = fVar180;
  auVar245._28_4_ = fVar180;
  auVar12 = vmovshdup_avx(auVar152);
  auVar105._0_8_ = auVar12._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  fVar219 = auVar61._0_4_;
  auVar191._4_4_ = fVar219;
  auVar191._0_4_ = fVar219;
  auVar191._8_4_ = fVar219;
  auVar191._12_4_ = fVar219;
  auVar191._16_4_ = fVar219;
  auVar191._20_4_ = fVar219;
  auVar191._24_4_ = fVar219;
  auVar191._28_4_ = fVar219;
  auVar128 = vmovshdup_avx(auVar61);
  auVar204._0_8_ = auVar128._0_8_;
  auVar204._8_8_ = auVar204._0_8_;
  auVar204._16_8_ = auVar204._0_8_;
  auVar204._24_8_ = auVar204._0_8_;
  fVar145 = auVar234._0_4_;
  auVar11 = vmovshdup_avx(auVar234);
  auVar89 = vfmadd132ps_fma(auVar81,auVar217,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar269,ZEXT1632(auVar89));
  fVar58 = auVar89._0_4_;
  fVar84 = auVar89._4_4_;
  auVar13._4_4_ = fVar180 * fVar84;
  auVar13._0_4_ = fVar180 * fVar58;
  fVar120 = auVar89._8_4_;
  auVar13._8_4_ = fVar180 * fVar120;
  fVar85 = auVar89._12_4_;
  auVar13._12_4_ = fVar180 * fVar85;
  auVar13._16_4_ = fVar180 * 0.0;
  auVar13._20_4_ = fVar180 * 0.0;
  auVar13._24_4_ = fVar180 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar89 = vfmadd231ps_fma(auVar13,auVar81,auVar263);
  fVar86 = auVar12._0_4_;
  fVar59 = auVar12._4_4_;
  auVar14._4_4_ = fVar59 * fVar84;
  auVar14._0_4_ = fVar86 * fVar58;
  auVar14._8_4_ = fVar86 * fVar120;
  auVar14._12_4_ = fVar59 * fVar85;
  auVar14._16_4_ = fVar86 * 0.0;
  auVar14._20_4_ = fVar59 * 0.0;
  auVar14._24_4_ = fVar86 * 0.0;
  auVar14._28_4_ = uVar55;
  auVar107 = vfmadd231ps_fma(auVar14,auVar81,auVar257);
  auVar15._4_4_ = fVar219 * fVar84;
  auVar15._0_4_ = fVar219 * fVar58;
  auVar15._8_4_ = fVar219 * fVar120;
  auVar15._12_4_ = fVar219 * fVar85;
  auVar15._16_4_ = fVar219 * 0.0;
  auVar15._20_4_ = fVar219 * 0.0;
  auVar15._24_4_ = fVar219 * 0.0;
  auVar15._28_4_ = auVar10._4_4_;
  auVar125 = vfmadd231ps_fma(auVar15,auVar81,auVar245);
  fVar86 = auVar128._0_4_;
  fVar59 = auVar128._4_4_;
  auVar9._4_4_ = fVar59 * fVar84;
  auVar9._0_4_ = fVar86 * fVar58;
  auVar9._8_4_ = fVar86 * fVar120;
  auVar9._12_4_ = fVar59 * fVar85;
  auVar9._16_4_ = fVar86 * 0.0;
  auVar9._20_4_ = fVar59 * 0.0;
  auVar9._24_4_ = fVar86 * 0.0;
  auVar9._28_4_ = fVar180;
  auVar90 = vfmadd231ps_fma(auVar9,auVar81,auVar105);
  auVar10 = vshufps_avx(auVar241,auVar241,0xaa);
  local_3a8._8_8_ = auVar10._0_8_;
  local_3a8._0_8_ = local_3a8._8_8_;
  local_3a8._16_8_ = local_3a8._8_8_;
  local_3a8._24_8_ = local_3a8._8_8_;
  auVar12 = vshufps_avx(auVar241,auVar241,0xff);
  uStack_500 = auVar12._0_8_;
  local_508 = (undefined1  [8])uStack_500;
  uStack_4f8 = uStack_500;
  uStack_4f0 = uStack_500;
  auVar16._4_4_ = fVar145 * fVar84;
  auVar16._0_4_ = fVar145 * fVar58;
  auVar16._8_4_ = fVar145 * fVar120;
  auVar16._12_4_ = fVar145 * fVar85;
  auVar16._16_4_ = fVar145 * 0.0;
  auVar16._20_4_ = fVar145 * 0.0;
  auVar16._24_4_ = fVar145 * 0.0;
  auVar16._28_4_ = fVar145;
  auVar241 = vfmadd231ps_fma(auVar16,auVar81,auVar191);
  auVar12 = vshufps_avx(auVar152,auVar152,0xaa);
  auVar192._0_8_ = auVar12._0_8_;
  auVar192._8_8_ = auVar192._0_8_;
  auVar192._16_8_ = auVar192._0_8_;
  auVar192._24_8_ = auVar192._0_8_;
  auVar128 = vshufps_avx(auVar152,auVar152,0xff);
  local_338._8_8_ = auVar128._0_8_;
  local_338._0_8_ = local_338._8_8_;
  local_338._16_8_ = local_338._8_8_;
  local_338._24_8_ = local_338._8_8_;
  fVar86 = auVar11._0_4_;
  fVar59 = auVar11._4_4_;
  auVar18._4_4_ = fVar59 * fVar84;
  auVar18._0_4_ = fVar86 * fVar58;
  auVar18._8_4_ = fVar86 * fVar120;
  auVar18._12_4_ = fVar59 * fVar85;
  auVar18._16_4_ = fVar86 * 0.0;
  auVar18._20_4_ = fVar59 * 0.0;
  auVar18._24_4_ = fVar86 * 0.0;
  auVar18._28_4_ = auVar10._4_4_;
  auVar121 = vfmadd231ps_fma(auVar18,auVar81,auVar204);
  auVar247._28_4_ = fVar59;
  auVar247._0_28_ =
       ZEXT1628(CONCAT412(auVar125._12_4_ * fVar85,
                          CONCAT48(auVar125._8_4_ * fVar120,
                                   CONCAT44(auVar125._4_4_ * fVar84,auVar125._0_4_ * fVar58))));
  auVar89 = vfmadd231ps_fma(auVar247,auVar81,ZEXT1632(auVar89));
  fVar86 = auVar128._4_4_;
  auVar19._28_4_ = fVar86;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar90._12_4_ * fVar85,
                          CONCAT48(auVar90._8_4_ * fVar120,
                                   CONCAT44(auVar90._4_4_ * fVar84,auVar90._0_4_ * fVar58))));
  auVar107 = vfmadd231ps_fma(auVar19,auVar81,ZEXT1632(auVar107));
  auVar10 = vshufps_avx(auVar61,auVar61,0xaa);
  uVar87 = auVar10._0_8_;
  auVar179._8_8_ = uVar87;
  auVar179._0_8_ = uVar87;
  auVar179._16_8_ = uVar87;
  auVar179._24_8_ = uVar87;
  auVar11 = vshufps_avx(auVar61,auVar61,0xff);
  uVar87 = auVar11._0_8_;
  auVar270._8_8_ = uVar87;
  auVar270._0_8_ = uVar87;
  auVar270._16_8_ = uVar87;
  auVar270._24_8_ = uVar87;
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar85,
                                               CONCAT48(auVar241._8_4_ * fVar120,
                                                        CONCAT44(auVar241._4_4_ * fVar84,
                                                                 auVar241._0_4_ * fVar58)))),auVar81
                            ,ZEXT1632(auVar125));
  auVar241 = vshufps_avx(auVar234,auVar234,0xaa);
  auVar152 = vshufps_avx(auVar234,auVar234,0xff);
  auVar234 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar121._12_4_,
                                                CONCAT48(fVar120 * auVar121._8_4_,
                                                         CONCAT44(fVar84 * auVar121._4_4_,
                                                                  fVar58 * auVar121._0_4_)))),
                             auVar81,ZEXT1632(auVar90));
  auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar61._12_4_,
                                                CONCAT48(fVar120 * auVar61._8_4_,
                                                         CONCAT44(fVar84 * auVar61._4_4_,
                                                                  fVar58 * auVar61._0_4_)))),auVar81
                             ,ZEXT1632(auVar89));
  auVar13 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar89));
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar234._12_4_,
                                               CONCAT48(fVar120 * auVar234._8_4_,
                                                        CONCAT44(fVar84 * auVar234._4_4_,
                                                                 fVar58 * auVar234._0_4_)))),auVar81
                            ,ZEXT1632(auVar107));
  auVar14 = vsubps_avx(ZEXT1632(auVar234),ZEXT1632(auVar107));
  fStack_2ec = auVar14._28_4_;
  auVar246._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar246._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar246._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar246._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar246._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar246._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar246._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar246._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fVar59 = auVar12._0_4_;
  fVar145 = auVar12._4_4_;
  auVar20._4_4_ = fVar145 * fVar84;
  auVar20._0_4_ = fVar59 * fVar58;
  auVar20._8_4_ = fVar59 * fVar120;
  auVar20._12_4_ = fVar145 * fVar85;
  auVar20._16_4_ = fVar59 * 0.0;
  auVar20._20_4_ = fVar145 * 0.0;
  auVar20._24_4_ = fVar59 * 0.0;
  auVar20._28_4_ = fStack_2ec;
  auVar12 = vfmadd231ps_fma(auVar20,auVar81,local_3a8);
  fVar59 = auVar128._0_4_;
  auVar21._4_4_ = fVar86 * fVar84;
  auVar21._0_4_ = fVar59 * fVar58;
  auVar21._8_4_ = fVar59 * fVar120;
  auVar21._12_4_ = fVar86 * fVar85;
  auVar21._16_4_ = fVar59 * 0.0;
  auVar21._20_4_ = fVar86 * 0.0;
  auVar21._24_4_ = fVar59 * 0.0;
  auVar21._28_4_ = 0;
  auVar128 = vfmadd231ps_fma(auVar21,auVar81,_local_508);
  fVar86 = auVar10._0_4_;
  fVar59 = auVar10._4_4_;
  auVar22._4_4_ = fVar59 * fVar84;
  auVar22._0_4_ = fVar86 * fVar58;
  auVar22._8_4_ = fVar86 * fVar120;
  auVar22._12_4_ = fVar59 * fVar85;
  auVar22._16_4_ = fVar86 * 0.0;
  auVar22._20_4_ = fVar59 * 0.0;
  auVar22._24_4_ = fVar86 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar10 = vfmadd231ps_fma(auVar22,auVar81,auVar192);
  fVar86 = auVar11._0_4_;
  fVar219 = auVar11._4_4_;
  auVar23._4_4_ = fVar219 * fVar84;
  auVar23._0_4_ = fVar86 * fVar58;
  auVar23._8_4_ = fVar86 * fVar120;
  auVar23._12_4_ = fVar219 * fVar85;
  auVar23._16_4_ = fVar86 * 0.0;
  auVar23._20_4_ = fVar219 * 0.0;
  auVar23._24_4_ = fVar86 * 0.0;
  auVar23._28_4_ = fVar145;
  auVar11 = vfmadd231ps_fma(auVar23,auVar81,local_338);
  local_338 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar125));
  fVar86 = auVar241._0_4_;
  fVar59 = auVar241._4_4_;
  auVar24._4_4_ = fVar59 * fVar84;
  auVar24._0_4_ = fVar86 * fVar58;
  auVar24._8_4_ = fVar86 * fVar120;
  auVar24._12_4_ = fVar59 * fVar85;
  auVar24._16_4_ = fVar86 * 0.0;
  auVar24._20_4_ = fVar59 * 0.0;
  auVar24._24_4_ = fVar86 * 0.0;
  auVar24._28_4_ = fVar59;
  auVar241 = vfmadd231ps_fma(auVar24,auVar81,auVar179);
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar61));
  auVar18 = _local_508;
  fVar86 = auVar152._0_4_;
  fVar59 = auVar152._4_4_;
  auVar25._4_4_ = fVar59 * fVar84;
  auVar25._0_4_ = fVar86 * fVar58;
  auVar25._8_4_ = fVar86 * fVar120;
  auVar25._12_4_ = fVar59 * fVar85;
  auVar25._16_4_ = fVar86 * 0.0;
  auVar25._20_4_ = fVar59 * 0.0;
  auVar25._24_4_ = fVar86 * 0.0;
  auVar25._28_4_ = fVar59;
  auVar152 = vfmadd231ps_fma(auVar25,auVar81,auVar270);
  auVar26._28_4_ = fVar219;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar10._12_4_ * fVar85,
                          CONCAT48(auVar10._8_4_ * fVar120,
                                   CONCAT44(auVar10._4_4_ * fVar84,auVar10._0_4_ * fVar58))));
  auVar12 = vfmadd231ps_fma(auVar26,auVar81,ZEXT1632(auVar12));
  auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar11._12_4_,
                                                CONCAT48(fVar120 * auVar11._8_4_,
                                                         CONCAT44(fVar84 * auVar11._4_4_,
                                                                  fVar58 * auVar11._0_4_)))),auVar81
                             ,ZEXT1632(auVar128));
  local_3a8._0_4_ = auVar125._0_4_ + auVar246._0_4_;
  local_3a8._4_4_ = auVar125._4_4_ + auVar246._4_4_;
  local_3a8._8_4_ = auVar125._8_4_ + auVar246._8_4_;
  local_3a8._12_4_ = auVar125._12_4_ + auVar246._12_4_;
  local_3a8._16_4_ = auVar246._16_4_ + 0.0;
  local_3a8._20_4_ = auVar246._20_4_ + 0.0;
  local_3a8._24_4_ = auVar246._24_4_ + 0.0;
  local_3a8._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar85,
                                               CONCAT48(auVar241._8_4_ * fVar120,
                                                        CONCAT44(auVar241._4_4_ * fVar84,
                                                                 auVar241._0_4_ * fVar58)))),auVar81
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar152._12_4_ * fVar85,
                                               CONCAT48(auVar152._8_4_ * fVar120,
                                                        CONCAT44(auVar152._4_4_ * fVar84,
                                                                 auVar152._0_4_ * fVar58)))),auVar81
                            ,ZEXT1632(auVar11));
  auVar241 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar10._12_4_,
                                                CONCAT48(fVar120 * auVar10._8_4_,
                                                         CONCAT44(fVar84 * auVar10._4_4_,
                                                                  fVar58 * auVar10._0_4_)))),auVar81
                             ,ZEXT1632(auVar12));
  auVar152 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar85,
                                                CONCAT48(auVar11._8_4_ * fVar120,
                                                         CONCAT44(auVar11._4_4_ * fVar84,
                                                                  auVar11._0_4_ * fVar58)))),
                             ZEXT1632(auVar128),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar13 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar128));
  auVar264._0_4_ = fStack_140 * auVar81._0_4_ * 3.0;
  auVar264._4_4_ = fStack_140 * auVar81._4_4_ * 3.0;
  auVar264._8_4_ = fStack_140 * auVar81._8_4_ * 3.0;
  auVar264._12_4_ = fStack_140 * auVar81._12_4_ * 3.0;
  auVar264._16_4_ = fStack_140 * auVar81._16_4_ * 3.0;
  auVar264._20_4_ = fStack_140 * auVar81._20_4_ * 3.0;
  auVar264._24_4_ = fStack_140 * auVar81._24_4_ * 3.0;
  auVar264._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_358 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar241));
  _local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar152));
  auVar81 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar125));
  auVar13 = vsubps_avx(ZEXT1632(auVar152),ZEXT1632(auVar61));
  auVar14 = vsubps_avx(_local_358,local_338);
  fVar180 = auVar81._0_4_ + auVar14._0_4_;
  fVar194 = auVar81._4_4_ + auVar14._4_4_;
  fVar195 = auVar81._8_4_ + auVar14._8_4_;
  fVar196 = auVar81._12_4_ + auVar14._12_4_;
  fVar144 = auVar81._16_4_ + auVar14._16_4_;
  fVar161 = auVar81._20_4_ + auVar14._20_4_;
  fVar162 = auVar81._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(_local_2a8,_local_508);
  auVar82._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar82._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar82._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar82._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar82._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar82._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar82._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar82._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar61);
  fVar58 = auVar61._0_4_;
  local_178 = (float)local_308._0_4_ + fVar58;
  fVar84 = auVar61._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar84;
  fVar120 = auVar61._8_4_;
  fStack_170 = fStack_300 + fVar120;
  fVar85 = auVar61._12_4_;
  fStack_16c = fStack_2fc + fVar85;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar125);
  auVar13 = vsubps_avx(local_b8,auVar246);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar241._0_4_ + auVar264._0_4_;
  local_118._4_4_ = auVar241._4_4_ + auVar264._4_4_;
  local_118._8_4_ = auVar241._8_4_ + auVar264._8_4_;
  local_118._12_4_ = auVar241._12_4_ + auVar264._12_4_;
  local_118._16_4_ = auVar264._16_4_ + 0.0;
  local_118._20_4_ = auVar264._20_4_ + 0.0;
  local_118._24_4_ = auVar264._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar247 = ZEXT1632(auVar241);
  auVar13 = vsubps_avx(auVar247,auVar264);
  auVar16 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar86 = auVar152._0_4_;
  local_158 = fVar86 + local_158;
  fVar59 = auVar152._4_4_;
  fStack_154 = fVar59 + fStack_154;
  fVar145 = auVar152._8_4_;
  fStack_150 = fVar145 + fStack_150;
  fVar219 = auVar152._12_4_;
  fStack_14c = fVar219 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar152),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar84 * fVar194;
  auVar28._0_4_ = fVar58 * fVar180;
  auVar28._8_4_ = fVar120 * fVar195;
  auVar28._12_4_ = fVar85 * fVar196;
  auVar28._16_4_ = fVar144 * 0.0;
  auVar28._20_4_ = fVar161 * 0.0;
  auVar28._24_4_ = fVar162 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar10 = vfnmadd231ps_fma(auVar28,local_b8,auVar82);
  fStack_15c = fStack_2ec + 0.0;
  auVar29._4_4_ = fStack_174 * fVar194;
  auVar29._0_4_ = local_178 * fVar180;
  auVar29._8_4_ = fStack_170 * fVar195;
  auVar29._12_4_ = fStack_16c * fVar196;
  auVar29._16_4_ = fStack_168 * fVar144;
  auVar29._20_4_ = fStack_164 * fVar161;
  auVar29._24_4_ = fStack_160 * fVar162;
  auVar29._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar29,auVar82,local_3a8);
  auVar30._4_4_ = local_198._4_4_ * fVar194;
  auVar30._0_4_ = local_198._0_4_ * fVar180;
  auVar30._8_4_ = local_198._8_4_ * fVar195;
  auVar30._12_4_ = local_198._12_4_ * fVar196;
  auVar30._16_4_ = local_198._16_4_ * fVar144;
  auVar30._20_4_ = local_198._20_4_ * fVar161;
  auVar30._24_4_ = local_198._24_4_ * fVar162;
  auVar30._28_4_ = fStack_2ec + 0.0;
  auVar128 = vfnmadd231ps_fma(auVar30,local_d8,auVar82);
  auVar31._4_4_ = (float)local_508._4_4_ * fVar194;
  auVar31._0_4_ = (float)local_508._0_4_ * fVar180;
  auVar31._8_4_ = (float)uStack_500 * fVar195;
  auVar31._12_4_ = uStack_500._4_4_ * fVar196;
  auVar31._16_4_ = (float)uStack_4f8 * fVar144;
  auVar31._20_4_ = uStack_4f8._4_4_ * fVar161;
  auVar31._24_4_ = (float)uStack_4f0 * fVar162;
  auVar31._28_4_ = uStack_4f0._4_4_;
  auVar11 = vfnmadd231ps_fma(auVar31,local_338,auVar82);
  auVar205._0_4_ = fVar86 * fVar180;
  auVar205._4_4_ = fVar59 * fVar194;
  auVar205._8_4_ = fVar145 * fVar195;
  auVar205._12_4_ = fVar219 * fVar196;
  auVar205._16_4_ = fVar144 * 0.0;
  auVar205._20_4_ = fVar161 * 0.0;
  auVar205._24_4_ = fVar162 * 0.0;
  auVar205._28_4_ = 0;
  auVar241 = vfnmadd231ps_fma(auVar205,auVar247,auVar82);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar194;
  auVar32._0_4_ = local_158 * fVar180;
  auVar32._8_4_ = fStack_150 * fVar195;
  auVar32._12_4_ = fStack_14c * fVar196;
  auVar32._16_4_ = fStack_148 * fVar144;
  auVar32._20_4_ = fStack_144 * fVar161;
  auVar32._24_4_ = fStack_140 * fVar162;
  auVar32._28_4_ = local_338._28_4_;
  auVar61 = vfnmadd231ps_fma(auVar32,local_118,auVar82);
  auVar33._4_4_ = local_138._4_4_ * fVar194;
  auVar33._0_4_ = local_138._0_4_ * fVar180;
  auVar33._8_4_ = local_138._8_4_ * fVar195;
  auVar33._12_4_ = local_138._12_4_ * fVar196;
  auVar33._16_4_ = local_138._16_4_ * fVar144;
  auVar33._20_4_ = local_138._20_4_ * fVar161;
  auVar33._24_4_ = local_138._24_4_ * fVar162;
  auVar33._28_4_ = local_138._28_4_;
  _local_308 = auVar16;
  auVar234 = vfnmadd231ps_fma(auVar33,auVar16,auVar82);
  auVar34._4_4_ = local_2a8._4_4_ * fVar194;
  auVar34._0_4_ = local_2a8._0_4_ * fVar180;
  auVar34._8_4_ = local_2a8._8_4_ * fVar195;
  auVar34._12_4_ = local_2a8._12_4_ * fVar196;
  auVar34._16_4_ = local_2a8._16_4_ * fVar144;
  auVar34._20_4_ = local_2a8._20_4_ * fVar161;
  auVar34._24_4_ = local_2a8._24_4_ * fVar162;
  auVar34._28_4_ = auVar81._28_4_ + auVar14._28_4_;
  auVar218 = ZEXT3264(_local_358);
  auVar89 = vfnmadd231ps_fma(auVar34,_local_358,auVar82);
  auVar13 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar81 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar14 = vminps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
  auVar81 = vmaxps_avx(auVar81,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar241),ZEXT1632(auVar61));
  auVar13 = vmaxps_avx(ZEXT1632(auVar241),ZEXT1632(auVar61));
  auVar9 = vminps_avx(ZEXT1632(auVar234),ZEXT1632(auVar89));
  auVar15 = vminps_avx(auVar15,auVar9);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar234),ZEXT1632(auVar89));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar81,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar81 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar81 = vandps_avx(auVar13,auVar81);
  auVar13 = local_1b8 & auVar81;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_338,local_b8);
    auVar14 = vsubps_avx(_local_358,auVar247);
    fVar194 = auVar13._0_4_ + auVar14._0_4_;
    fVar195 = auVar13._4_4_ + auVar14._4_4_;
    fVar196 = auVar13._8_4_ + auVar14._8_4_;
    fVar144 = auVar13._12_4_ + auVar14._12_4_;
    fVar161 = auVar13._16_4_ + auVar14._16_4_;
    fVar162 = auVar13._20_4_ + auVar14._20_4_;
    fVar163 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_508,local_f8);
    auVar9 = vsubps_avx(_local_2a8,ZEXT1632(auVar152));
    auVar106._0_4_ = auVar15._0_4_ + auVar9._0_4_;
    auVar106._4_4_ = auVar15._4_4_ + auVar9._4_4_;
    auVar106._8_4_ = auVar15._8_4_ + auVar9._8_4_;
    auVar106._12_4_ = auVar15._12_4_ + auVar9._12_4_;
    auVar106._16_4_ = auVar15._16_4_ + auVar9._16_4_;
    auVar106._20_4_ = auVar15._20_4_ + auVar9._20_4_;
    auVar106._24_4_ = auVar15._24_4_ + auVar9._24_4_;
    fVar180 = auVar9._28_4_;
    auVar106._28_4_ = auVar15._28_4_ + fVar180;
    auVar35._4_4_ = fVar84 * fVar195;
    auVar35._0_4_ = fVar58 * fVar194;
    auVar35._8_4_ = fVar120 * fVar196;
    auVar35._12_4_ = fVar85 * fVar144;
    auVar35._16_4_ = fVar161 * 0.0;
    auVar35._20_4_ = fVar162 * 0.0;
    auVar35._24_4_ = fVar163 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar241 = vfnmadd231ps_fma(auVar35,auVar106,local_b8);
    auVar36._4_4_ = fVar195 * fStack_174;
    auVar36._0_4_ = fVar194 * local_178;
    auVar36._8_4_ = fVar196 * fStack_170;
    auVar36._12_4_ = fVar144 * fStack_16c;
    auVar36._16_4_ = fVar161 * fStack_168;
    auVar36._20_4_ = fVar162 * fStack_164;
    auVar36._24_4_ = fVar163 * fStack_160;
    auVar36._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_3a8,auVar106,auVar36);
    auVar37._4_4_ = fVar195 * local_198._4_4_;
    auVar37._0_4_ = fVar194 * local_198._0_4_;
    auVar37._8_4_ = fVar196 * local_198._8_4_;
    auVar37._12_4_ = fVar144 * local_198._12_4_;
    auVar37._16_4_ = fVar161 * local_198._16_4_;
    auVar37._20_4_ = fVar162 * local_198._20_4_;
    auVar37._24_4_ = fVar163 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_d8,auVar106,auVar37);
    auVar38._4_4_ = (float)local_508._4_4_ * fVar195;
    auVar38._0_4_ = (float)local_508._0_4_ * fVar194;
    auVar38._8_4_ = (float)uStack_500 * fVar196;
    auVar38._12_4_ = uStack_500._4_4_ * fVar144;
    auVar38._16_4_ = (float)uStack_4f8 * fVar161;
    auVar38._20_4_ = uStack_4f8._4_4_ * fVar162;
    auVar38._24_4_ = (float)uStack_4f0 * fVar163;
    auVar38._28_4_ = 0;
    auVar152 = vfnmadd231ps_fma(auVar38,auVar106,local_338);
    auVar132._0_4_ = fVar86 * fVar194;
    auVar132._4_4_ = fVar59 * fVar195;
    auVar132._8_4_ = fVar145 * fVar196;
    auVar132._12_4_ = fVar219 * fVar144;
    auVar132._16_4_ = fVar161 * 0.0;
    auVar132._20_4_ = fVar162 * 0.0;
    auVar132._24_4_ = fVar163 * 0.0;
    auVar132._28_4_ = 0;
    auVar61 = vfnmadd231ps_fma(auVar132,auVar106,auVar247);
    auVar39._4_4_ = fVar195 * fStack_154;
    auVar39._0_4_ = fVar194 * local_158;
    auVar39._8_4_ = fVar196 * fStack_150;
    auVar39._12_4_ = fVar144 * fStack_14c;
    auVar39._16_4_ = fVar161 * fStack_148;
    auVar39._20_4_ = fVar162 * fStack_144;
    auVar39._24_4_ = fVar163 * fStack_140;
    auVar39._28_4_ = fVar180;
    auVar128 = vfnmadd213ps_fma(local_118,auVar106,auVar39);
    auVar40._4_4_ = fVar195 * local_138._4_4_;
    auVar40._0_4_ = fVar194 * local_138._0_4_;
    auVar40._8_4_ = fVar196 * local_138._8_4_;
    auVar40._12_4_ = fVar144 * local_138._12_4_;
    auVar40._16_4_ = fVar161 * local_138._16_4_;
    auVar40._20_4_ = fVar162 * local_138._20_4_;
    auVar40._24_4_ = fVar163 * local_138._24_4_;
    auVar40._28_4_ = fVar180;
    auVar11 = vfnmadd213ps_fma(auVar16,auVar106,auVar40);
    auVar218 = ZEXT1664(auVar11);
    auVar41._4_4_ = fVar195 * local_2a8._4_4_;
    auVar41._0_4_ = fVar194 * local_2a8._0_4_;
    auVar41._8_4_ = fVar196 * local_2a8._8_4_;
    auVar41._12_4_ = fVar144 * local_2a8._12_4_;
    auVar41._16_4_ = fVar161 * local_2a8._16_4_;
    auVar41._20_4_ = fVar162 * local_2a8._20_4_;
    auVar41._24_4_ = fVar163 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar234 = vfnmadd231ps_fma(auVar41,auVar106,_local_358);
    auVar14 = vminps_avx(ZEXT1632(auVar241),ZEXT1632(auVar10));
    auVar13 = vmaxps_avx(ZEXT1632(auVar241),ZEXT1632(auVar10));
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar152));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar152));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vminps_avx(ZEXT1632(auVar61),ZEXT1632(auVar128));
    auVar14 = vmaxps_avx(ZEXT1632(auVar61),ZEXT1632(auVar128));
    auVar16 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar234));
    auVar9 = vminps_avx(auVar9,auVar16);
    auVar9 = vminps_avx(auVar15,auVar9);
    auVar15 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar234));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar9,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar81 = vandps_avx(auVar81,local_1b8);
    auVar14 = auVar81 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar13,auVar81);
      uVar53 = vmovmskps_avx(auVar81);
      if (uVar53 != 0) {
        auStack_2e8[uVar54] = uVar53 & 0xff;
        uVar87 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar54 * 2) = uVar87;
        uVar57 = vmovlps_avx(auVar68);
        auStack_58[uVar54] = uVar57;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
  }
LAB_01181cc2:
  _local_508 = auVar18;
  if ((int)uVar54 == 0) {
    fVar58 = (ray->super_RayK<1>).tfar;
    auVar80._4_4_ = fVar58;
    auVar80._0_4_ = fVar58;
    auVar80._8_4_ = fVar58;
    auVar80._12_4_ = fVar58;
    auVar10 = vcmpps_avx(local_288,auVar80,2);
    uVar48 = vmovmskps_avx(auVar10);
    uVar56 = (ulong)((uint)uVar56 & uVar48);
    goto LAB_01180fd7;
  }
  uVar47 = (int)uVar54 - 1;
  uVar49 = (ulong)uVar47;
  uVar52 = auStack_2e8[uVar49];
  uVar53 = (&uStack_1d8)[uVar49 * 2];
  fVar58 = afStack_1d4[uVar49 * 2];
  iVar17 = 0;
  for (uVar57 = (ulong)uVar52; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    iVar17 = iVar17 + 1;
  }
  uVar52 = uVar52 - 1 & uVar52;
  if (uVar52 == 0) {
    uVar54 = (ulong)uVar47;
  }
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auStack_58[uVar49];
  auStack_2e8[uVar49] = uVar52;
  fVar84 = (float)(iVar17 + 1) * 0.14285715;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)iVar17 * 0.14285715)),ZEXT416(uVar53),
                            ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar84)),ZEXT416(uVar53),
                            ZEXT416((uint)(1.0 - fVar84)));
  fVar84 = auVar12._0_4_;
  auVar193._0_4_ = auVar10._0_4_;
  fVar58 = fVar84 - auVar193._0_4_;
  if (fVar58 < 0.16666667) {
    auVar128 = vshufps_avx(auVar68,auVar68,0x50);
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = 0x3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar11 = vsubps_avx(auVar95,auVar128);
    fVar120 = auVar128._0_4_;
    auVar139._0_4_ = fVar120 * (float)local_3f8._0_4_;
    fVar85 = auVar128._4_4_;
    auVar139._4_4_ = fVar85 * (float)local_3f8._4_4_;
    fVar86 = auVar128._8_4_;
    auVar139._8_4_ = fVar86 * fStack_3f0;
    fVar59 = auVar128._12_4_;
    auVar139._12_4_ = fVar59 * fStack_3ec;
    auVar150._0_4_ = fVar120 * (float)local_408._0_4_;
    auVar150._4_4_ = fVar85 * (float)local_408._4_4_;
    auVar150._8_4_ = fVar86 * fStack_400;
    auVar150._12_4_ = fVar59 * fStack_3fc;
    auVar176._0_4_ = fVar120 * (float)local_418._0_4_;
    auVar176._4_4_ = fVar85 * (float)local_418._4_4_;
    auVar176._8_4_ = fVar86 * fStack_410;
    auVar176._12_4_ = fVar59 * fStack_40c;
    auVar70._0_4_ = fVar120 * (float)local_428._0_4_;
    auVar70._4_4_ = fVar85 * (float)local_428._4_4_;
    auVar70._8_4_ = fVar86 * fStack_420;
    auVar70._12_4_ = fVar59 * fStack_41c;
    auVar128 = vfmadd231ps_fma(auVar139,auVar11,local_3b8);
    auVar241 = vfmadd231ps_fma(auVar150,auVar11,local_3c8);
    auVar152 = vfmadd231ps_fma(auVar176,auVar11,local_3d8);
    auVar11 = vfmadd231ps_fma(auVar70,auVar11,local_3e8);
    auVar133._16_16_ = auVar128;
    auVar133._0_16_ = auVar128;
    auVar143._16_16_ = auVar241;
    auVar143._0_16_ = auVar241;
    auVar160._16_16_ = auVar152;
    auVar160._0_16_ = auVar152;
    _local_508 = auVar10;
    auVar193._4_4_ = auVar193._0_4_;
    auVar193._8_4_ = auVar193._0_4_;
    auVar193._12_4_ = auVar193._0_4_;
    auVar193._20_4_ = fVar84;
    auVar193._16_4_ = fVar84;
    auVar193._24_4_ = fVar84;
    auVar193._28_4_ = fVar84;
    auVar81 = vsubps_avx(auVar143,auVar133);
    auVar241 = vfmadd213ps_fma(auVar81,auVar193,auVar133);
    auVar81 = vsubps_avx(auVar160,auVar143);
    auVar61 = vfmadd213ps_fma(auVar81,auVar193,auVar143);
    auVar128 = vsubps_avx(auVar11,auVar152);
    auVar83._16_16_ = auVar128;
    auVar83._0_16_ = auVar128;
    auVar128 = vfmadd213ps_fma(auVar83,auVar193,auVar160);
    auVar81 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar241));
    auVar11 = vfmadd213ps_fma(auVar81,auVar193,ZEXT1632(auVar241));
    auVar81 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar61));
    auVar128 = vfmadd213ps_fma(auVar81,auVar193,ZEXT1632(auVar61));
    auVar81 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar81,auVar193);
    fVar219 = auVar81._4_4_ * 3.0;
    local_338._0_4_ = fVar58;
    fVar120 = fVar58 * 0.33333334;
    auVar185._0_8_ =
         CONCAT44(auVar89._4_4_ + fVar120 * fVar219,auVar89._0_4_ + fVar120 * auVar81._0_4_ * 3.0);
    auVar185._8_4_ = auVar89._8_4_ + fVar120 * auVar81._8_4_ * 3.0;
    auVar185._12_4_ = auVar89._12_4_ + fVar120 * auVar81._12_4_ * 3.0;
    _local_2a8 = vshufpd_avx(auVar89,auVar89,3);
    auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar128 = vsubps_avx(_local_2a8,auVar89);
    _local_358 = auVar11;
    auVar241 = vsubps_avx(auVar11,(undefined1  [16])0x0);
    auVar71._0_4_ = auVar128._0_4_ + auVar241._0_4_;
    auVar71._4_4_ = auVar128._4_4_ + auVar241._4_4_;
    auVar71._8_4_ = auVar128._8_4_ + auVar241._8_4_;
    auVar71._12_4_ = auVar128._12_4_ + auVar241._12_4_;
    auVar128 = vshufps_avx(auVar89,auVar89,0xb1);
    auVar241 = vshufps_avx(auVar185,auVar185,0xb1);
    auVar260._4_4_ = auVar71._0_4_;
    auVar260._0_4_ = auVar71._0_4_;
    auVar260._8_4_ = auVar71._0_4_;
    auVar260._12_4_ = auVar71._0_4_;
    auVar152 = vshufps_avx(auVar71,auVar71,0x55);
    fVar85 = auVar152._0_4_;
    auVar72._0_4_ = fVar85 * auVar128._0_4_;
    fVar86 = auVar152._4_4_;
    auVar72._4_4_ = fVar86 * auVar128._4_4_;
    fVar59 = auVar152._8_4_;
    auVar72._8_4_ = fVar59 * auVar128._8_4_;
    fVar145 = auVar152._12_4_;
    auVar72._12_4_ = fVar145 * auVar128._12_4_;
    auVar151._0_4_ = fVar85 * auVar241._0_4_;
    auVar151._4_4_ = fVar86 * auVar241._4_4_;
    auVar151._8_4_ = fVar59 * auVar241._8_4_;
    auVar151._12_4_ = fVar145 * auVar241._12_4_;
    auVar61 = vfmadd231ps_fma(auVar72,auVar260,auVar89);
    _local_308 = auVar185;
    auVar234 = vfmadd231ps_fma(auVar151,auVar260,auVar185);
    auVar241 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar152 = vshufps_avx(auVar234,auVar234,0xe8);
    auVar128 = vcmpps_avx(auVar241,auVar152,1);
    uVar53 = vextractps_avx(auVar128,0);
    auVar107 = auVar234;
    if ((uVar53 & 1) == 0) {
      auVar107 = auVar61;
    }
    local_3a8._0_16_ = auVar12;
    auVar124._0_4_ = fVar120 * auVar81._16_4_ * 3.0;
    auVar124._4_4_ = fVar120 * fVar219;
    auVar124._8_4_ = fVar120 * auVar81._24_4_ * 3.0;
    auVar124._12_4_ = fVar120 * auVar218._28_4_;
    auVar134 = vsubps_avx((undefined1  [16])0x0,auVar124);
    auVar125 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar90 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar186._0_4_ = fVar85 * auVar125._0_4_;
    auVar186._4_4_ = fVar86 * auVar125._4_4_;
    auVar186._8_4_ = fVar59 * auVar125._8_4_;
    auVar186._12_4_ = fVar145 * auVar125._12_4_;
    auVar201._0_4_ = auVar90._0_4_ * fVar85;
    auVar201._4_4_ = auVar90._4_4_ * fVar86;
    auVar201._8_4_ = auVar90._8_4_ * fVar59;
    auVar201._12_4_ = auVar90._12_4_ * fVar145;
    auVar60 = vfmadd231ps_fma(auVar186,auVar260,auVar134);
    auVar88 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar260);
    auVar90 = vshufps_avx(auVar60,auVar60,0xe8);
    auVar121 = vshufps_avx(auVar88,auVar88,0xe8);
    auVar218 = ZEXT1664(auVar121);
    auVar125 = vcmpps_avx(auVar90,auVar121,1);
    uVar53 = vextractps_avx(auVar125,0);
    auVar146 = auVar88;
    if ((uVar53 & 1) == 0) {
      auVar146 = auVar60;
    }
    auVar107 = vmaxss_avx(auVar146,auVar107);
    auVar241 = vminps_avx(auVar241,auVar152);
    auVar152 = vminps_avx(auVar90,auVar121);
    auVar152 = vminps_avx(auVar241,auVar152);
    auVar128 = vshufps_avx(auVar128,auVar128,0x55);
    auVar128 = vblendps_avx(auVar128,auVar125,2);
    auVar125 = vpslld_avx(auVar128,0x1f);
    auVar128 = vshufpd_avx(auVar234,auVar234,1);
    auVar128 = vinsertps_avx(auVar128,auVar88,0x9c);
    auVar241 = vshufpd_avx(auVar61,auVar61,1);
    auVar241 = vinsertps_avx(auVar241,auVar60,0x9c);
    auVar128 = vblendvps_avx(auVar241,auVar128,auVar125);
    auVar241 = vmovshdup_avx(auVar128);
    auVar128 = vmaxss_avx(auVar241,auVar128);
    fVar59 = auVar152._0_4_;
    auVar241 = vmovshdup_avx(auVar152);
    fVar86 = auVar128._0_4_;
    fVar120 = auVar241._0_4_;
    fVar85 = auVar107._0_4_;
    auVar18 = _local_508;
    if (((0.0001 <= fVar59) || (fVar86 <= -0.0001)) && (0.0001 <= fVar120 || fVar86 <= -0.0001))
    goto code_r0x01181fcc;
    goto LAB_01181ff2;
  }
  local_238 = vinsertps_avx(auVar10,auVar12,0x10);
  goto LAB_01181713;
code_r0x01181fcc:
  auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar61 = vcmpps_avx(auVar152,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar241 = vandps_avx(auVar61,auVar241);
  if (fVar85 <= -0.0001 || (auVar241 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01181cc2;
LAB_01181ff2:
  auVar61 = vcmpps_avx(auVar152,_DAT_01f45a50,1);
  auVar234 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar241 = vcmpss_avx(auVar107,ZEXT816(0) << 0x20,1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar241 = vblendvps_avx(auVar96,auVar112,auVar241);
  auVar61 = vblendvps_avx(auVar96,auVar112,auVar61);
  fVar219 = auVar61._0_4_;
  fVar145 = auVar241._0_4_;
  auVar241 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar219 == fVar145) && (!NAN(fVar219) && !NAN(fVar145))) {
    auVar241 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar219 == fVar145) && (!NAN(fVar219) && !NAN(fVar145))) {
    auVar234 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar61 = vmovshdup_avx(auVar61);
  fVar180 = auVar61._0_4_;
  if ((fVar219 != fVar180) || (NAN(fVar219) || NAN(fVar180))) {
    if ((fVar120 != fVar59) || (NAN(fVar120) || NAN(fVar59))) {
      auVar126._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
      auVar126._8_4_ = auVar152._8_4_ ^ 0x80000000;
      auVar126._12_4_ = auVar152._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar59 / (fVar120 - fVar59);
      auVar127._4_12_ = auVar126._4_12_;
      auVar152 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar127,ZEXT416(0));
      auVar61 = auVar152;
    }
    else {
      auVar152 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar61 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar152 = SUB6416(ZEXT464(0x7f800000),0);
        auVar61 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar152);
    auVar234 = vmaxss_avx(auVar61,auVar234);
  }
  auVar128 = vcmpss_avx(auVar128,ZEXT416(0),1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar128 = vblendvps_avx(auVar97,auVar113,auVar128);
  fVar120 = auVar128._0_4_;
  if ((fVar145 != fVar120) || (NAN(fVar145) || NAN(fVar120))) {
    if ((fVar86 != fVar85) || (NAN(fVar86) || NAN(fVar85))) {
      auVar73._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
      auVar73._8_4_ = auVar107._8_4_ ^ 0x80000000;
      auVar73._12_4_ = auVar107._12_4_ ^ 0x80000000;
      auVar129._0_4_ = -fVar85 / (fVar86 - fVar85);
      auVar129._4_12_ = auVar73._4_12_;
      auVar128 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar129,ZEXT416(0));
      auVar152 = auVar128;
    }
    else {
      auVar128 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar152 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar128 = SUB6416(ZEXT464(0xff800000),0);
        auVar152 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar152);
    auVar234 = vmaxss_avx(auVar128,auVar234);
  }
  if ((fVar180 != fVar120) || (NAN(fVar180) || NAN(fVar120))) {
    auVar241 = vminss_avx(auVar241,SUB6416(ZEXT464(0x3f800000),0));
    auVar234 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar234);
  }
  auVar128 = vmaxss_avx(ZEXT816(0) << 0x40,auVar241);
  auVar241 = vminss_avx(auVar234,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar241._0_4_ < auVar128._0_4_) goto LAB_01181cc2;
  auVar128 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar128._0_4_ + -0.1)));
  auVar241 = vminss_avx(ZEXT416((uint)(auVar241._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar140._0_8_ = auVar89._0_8_;
  auVar140._8_8_ = auVar140._0_8_;
  auVar210._8_8_ = auVar185._0_8_;
  auVar210._0_8_ = auVar185._0_8_;
  auVar224._8_8_ = auVar134._0_8_;
  auVar224._0_8_ = auVar134._0_8_;
  auVar152 = vshufpd_avx(auVar185,auVar185,3);
  auVar61 = vshufpd_avx(auVar134,auVar134,3);
  auVar234 = vshufps_avx(auVar128,auVar241,0);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar89 = vsubps_avx(auVar74,auVar234);
  fVar120 = auVar234._0_4_;
  auVar75._0_4_ = fVar120 * (float)local_2a8._0_4_;
  fVar85 = auVar234._4_4_;
  auVar75._4_4_ = fVar85 * (float)local_2a8._4_4_;
  fVar86 = auVar234._8_4_;
  auVar75._8_4_ = fVar86 * fStack_2a0;
  fVar59 = auVar234._12_4_;
  auVar75._12_4_ = fVar59 * fStack_29c;
  auVar177._0_4_ = fVar120 * auVar152._0_4_;
  auVar177._4_4_ = fVar85 * auVar152._4_4_;
  auVar177._8_4_ = fVar86 * auVar152._8_4_;
  auVar177._12_4_ = fVar59 * auVar152._12_4_;
  auVar187._0_4_ = fVar120 * auVar61._0_4_;
  auVar187._4_4_ = fVar85 * auVar61._4_4_;
  auVar187._8_4_ = fVar86 * auVar61._8_4_;
  auVar187._12_4_ = fVar59 * auVar61._12_4_;
  local_358._0_4_ = auVar11._0_4_;
  local_358._4_4_ = auVar11._4_4_;
  fStack_350 = auVar11._8_4_;
  fStack_34c = auVar11._12_4_;
  auVar202._0_4_ = fVar120 * (float)local_358._0_4_;
  auVar202._4_4_ = fVar85 * (float)local_358._4_4_;
  auVar202._8_4_ = fVar86 * fStack_350;
  auVar202._12_4_ = fVar59 * fStack_34c;
  auVar61 = vfmadd231ps_fma(auVar75,auVar89,auVar140);
  auVar234 = vfmadd231ps_fma(auVar177,auVar89,auVar210);
  auVar107 = vfmadd231ps_fma(auVar187,auVar89,auVar224);
  auVar89 = vfmadd231ps_fma(auVar202,auVar89,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar68);
  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar128._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar128._0_4_)));
  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar241._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar241._0_4_)));
  fVar120 = 1.0 / fVar58;
  auVar128 = vsubps_avx(auVar234,auVar61);
  auVar211._0_4_ = auVar128._0_4_ * 3.0;
  auVar211._4_4_ = auVar128._4_4_ * 3.0;
  auVar211._8_4_ = auVar128._8_4_ * 3.0;
  auVar211._12_4_ = auVar128._12_4_ * 3.0;
  auVar128 = vsubps_avx(auVar107,auVar234);
  auVar225._0_4_ = auVar128._0_4_ * 3.0;
  auVar225._4_4_ = auVar128._4_4_ * 3.0;
  auVar225._8_4_ = auVar128._8_4_ * 3.0;
  auVar225._12_4_ = auVar128._12_4_ * 3.0;
  auVar128 = vsubps_avx(auVar89,auVar107);
  auVar235._0_4_ = auVar128._0_4_ * 3.0;
  auVar235._4_4_ = auVar128._4_4_ * 3.0;
  auVar235._8_4_ = auVar128._8_4_ * 3.0;
  auVar235._12_4_ = auVar128._12_4_ * 3.0;
  auVar11 = vminps_avx(auVar225,auVar235);
  auVar128 = vmaxps_avx(auVar225,auVar235);
  auVar11 = vminps_avx(auVar211,auVar11);
  auVar128 = vmaxps_avx(auVar211,auVar128);
  auVar241 = vshufpd_avx(auVar11,auVar11,3);
  auVar152 = vshufpd_avx(auVar128,auVar128,3);
  auVar11 = vminps_avx(auVar11,auVar241);
  auVar128 = vmaxps_avx(auVar128,auVar152);
  auVar226._0_4_ = auVar11._0_4_ * fVar120;
  auVar226._4_4_ = auVar11._4_4_ * fVar120;
  auVar226._8_4_ = auVar11._8_4_ * fVar120;
  auVar226._12_4_ = auVar11._12_4_ * fVar120;
  auVar212._0_4_ = auVar128._0_4_ * fVar120;
  auVar212._4_4_ = auVar128._4_4_ * fVar120;
  auVar212._8_4_ = auVar128._8_4_ * fVar120;
  auVar212._12_4_ = auVar128._12_4_ * fVar120;
  fVar120 = 1.0 / (auVar88._0_4_ - auVar60._0_4_);
  auVar128 = vshufpd_avx(auVar61,auVar61,3);
  auVar11 = vshufpd_avx(auVar234,auVar234,3);
  auVar241 = vshufpd_avx(auVar107,auVar107,3);
  auVar152 = vshufpd_avx(auVar89,auVar89,3);
  auVar128 = vsubps_avx(auVar128,auVar61);
  auVar61 = vsubps_avx(auVar11,auVar234);
  auVar234 = vsubps_avx(auVar241,auVar107);
  auVar152 = vsubps_avx(auVar152,auVar89);
  auVar11 = vminps_avx(auVar128,auVar61);
  auVar128 = vmaxps_avx(auVar128,auVar61);
  auVar241 = vminps_avx(auVar234,auVar152);
  auVar241 = vminps_avx(auVar11,auVar241);
  auVar11 = vmaxps_avx(auVar234,auVar152);
  auVar128 = vmaxps_avx(auVar128,auVar11);
  auVar252._0_4_ = fVar120 * auVar241._0_4_;
  auVar252._4_4_ = fVar120 * auVar241._4_4_;
  auVar252._8_4_ = fVar120 * auVar241._8_4_;
  auVar252._12_4_ = fVar120 * auVar241._12_4_;
  auVar242._0_4_ = fVar120 * auVar128._0_4_;
  auVar242._4_4_ = fVar120 * auVar128._4_4_;
  auVar242._8_4_ = fVar120 * auVar128._8_4_;
  auVar242._12_4_ = fVar120 * auVar128._12_4_;
  auVar152 = vinsertps_avx(auVar10,auVar60,0x10);
  auVar61 = vinsertps_avx(auVar12,auVar88,0x10);
  auVar236._0_4_ = (auVar152._0_4_ + auVar61._0_4_) * 0.5;
  auVar236._4_4_ = (auVar152._4_4_ + auVar61._4_4_) * 0.5;
  auVar236._8_4_ = (auVar152._8_4_ + auVar61._8_4_) * 0.5;
  auVar236._12_4_ = (auVar152._12_4_ + auVar61._12_4_) * 0.5;
  auVar76._4_4_ = auVar236._0_4_;
  auVar76._0_4_ = auVar236._0_4_;
  auVar76._8_4_ = auVar236._0_4_;
  auVar76._12_4_ = auVar236._0_4_;
  auVar128 = vfmadd213ps_fma(local_1e8,auVar76,local_4c8);
  auVar11 = vfmadd213ps_fma(local_1f8,auVar76,local_4d8);
  auVar241 = vfmadd213ps_fma(local_208,auVar76,local_4e8);
  auVar12 = vsubps_avx(auVar11,auVar128);
  auVar128 = vfmadd213ps_fma(auVar12,auVar76,auVar128);
  auVar12 = vsubps_avx(auVar241,auVar11);
  auVar12 = vfmadd213ps_fma(auVar12,auVar76,auVar11);
  auVar12 = vsubps_avx(auVar12,auVar128);
  auVar128 = vfmadd231ps_fma(auVar128,auVar12,auVar76);
  auVar77._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
  auVar77._8_4_ = auVar12._8_4_ * 3.0;
  auVar77._12_4_ = auVar12._12_4_ * 3.0;
  auVar261._8_8_ = auVar128._0_8_;
  auVar261._0_8_ = auVar128._0_8_;
  auVar12 = vshufpd_avx(auVar128,auVar128,3);
  auVar128 = vshufps_avx(auVar236,auVar236,0x55);
  auVar89 = vsubps_avx(auVar12,auVar261);
  auVar125 = vfmadd231ps_fma(auVar261,auVar128,auVar89);
  auVar267._8_8_ = auVar77._0_8_;
  auVar267._0_8_ = auVar77._0_8_;
  auVar12 = vshufpd_avx(auVar77,auVar77,3);
  auVar12 = vsubps_avx(auVar12,auVar267);
  auVar107 = vfmadd213ps_fma(auVar12,auVar128,auVar267);
  auVar128 = vmovshdup_avx(auVar107);
  auVar268._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
  auVar268._8_4_ = auVar128._8_4_ ^ 0x80000000;
  auVar268._12_4_ = auVar128._12_4_ ^ 0x80000000;
  auVar11 = vmovshdup_avx(auVar89);
  auVar12 = vunpcklps_avx(auVar11,auVar268);
  auVar241 = vshufps_avx(auVar12,auVar268,4);
  auVar234 = vshufps_avx(auVar236,auVar236,0x54);
  auVar130._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
  auVar130._8_4_ = auVar89._8_4_ ^ 0x80000000;
  auVar130._12_4_ = auVar89._12_4_ ^ 0x80000000;
  auVar12 = vmovlhps_avx(auVar130,auVar107);
  auVar12 = vshufps_avx(auVar12,auVar107,8);
  auVar128 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar128._0_4_)),auVar11,auVar107);
  uVar55 = auVar128._0_4_;
  auVar78._4_4_ = uVar55;
  auVar78._0_4_ = uVar55;
  auVar78._8_4_ = uVar55;
  auVar78._12_4_ = uVar55;
  auVar128 = vdivps_avx(auVar241,auVar78);
  auVar11 = vdivps_avx(auVar12,auVar78);
  fVar86 = auVar125._0_4_;
  fVar120 = auVar128._0_4_;
  auVar12 = vshufps_avx(auVar125,auVar125,0x55);
  fVar85 = auVar11._0_4_;
  auVar79._0_4_ = fVar86 * fVar120 + auVar12._0_4_ * fVar85;
  auVar79._4_4_ = fVar86 * auVar128._4_4_ + auVar12._4_4_ * auVar11._4_4_;
  auVar79._8_4_ = fVar86 * auVar128._8_4_ + auVar12._8_4_ * auVar11._8_4_;
  auVar79._12_4_ = fVar86 * auVar128._12_4_ + auVar12._12_4_ * auVar11._12_4_;
  auVar134 = vsubps_avx(auVar234,auVar79);
  auVar234 = vmovshdup_avx(auVar128);
  auVar12 = vinsertps_avx(auVar226,auVar252,0x1c);
  auVar153._0_4_ = auVar234._0_4_ * auVar12._0_4_;
  auVar153._4_4_ = auVar234._4_4_ * auVar12._4_4_;
  auVar153._8_4_ = auVar234._8_4_ * auVar12._8_4_;
  auVar153._12_4_ = auVar234._12_4_ * auVar12._12_4_;
  auVar241 = vinsertps_avx(auVar212,auVar242,0x1c);
  auVar98._0_4_ = auVar241._0_4_ * auVar234._0_4_;
  auVar98._4_4_ = auVar241._4_4_ * auVar234._4_4_;
  auVar98._8_4_ = auVar241._8_4_ * auVar234._8_4_;
  auVar98._12_4_ = auVar241._12_4_ * auVar234._12_4_;
  auVar125 = vminps_avx(auVar153,auVar98);
  auVar107 = vmaxps_avx(auVar98,auVar153);
  auVar234 = vinsertps_avx(auVar252,auVar226,0x4c);
  auVar90 = vmovshdup_avx(auVar11);
  auVar89 = vinsertps_avx(auVar242,auVar212,0x4c);
  auVar243._0_4_ = auVar90._0_4_ * auVar234._0_4_;
  auVar243._4_4_ = auVar90._4_4_ * auVar234._4_4_;
  auVar243._8_4_ = auVar90._8_4_ * auVar234._8_4_;
  auVar243._12_4_ = auVar90._12_4_ * auVar234._12_4_;
  auVar227._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar227._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar227._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar227._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar90 = vminps_avx(auVar243,auVar227);
  auVar253._0_4_ = auVar125._0_4_ + auVar90._0_4_;
  auVar253._4_4_ = auVar125._4_4_ + auVar90._4_4_;
  auVar253._8_4_ = auVar125._8_4_ + auVar90._8_4_;
  auVar253._12_4_ = auVar125._12_4_ + auVar90._12_4_;
  auVar125 = vmaxps_avx(auVar227,auVar243);
  auVar99._0_4_ = auVar125._0_4_ + auVar107._0_4_;
  auVar99._4_4_ = auVar125._4_4_ + auVar107._4_4_;
  auVar99._8_4_ = auVar125._8_4_ + auVar107._8_4_;
  auVar99._12_4_ = auVar125._12_4_ + auVar107._12_4_;
  auVar228._8_8_ = 0x3f80000000000000;
  auVar228._0_8_ = 0x3f80000000000000;
  auVar107 = vsubps_avx(auVar228,auVar99);
  auVar125 = vsubps_avx(auVar228,auVar253);
  auVar90 = vsubps_avx(auVar152,auVar236);
  auVar121 = vsubps_avx(auVar61,auVar236);
  auVar114._0_4_ = fVar120 * auVar12._0_4_;
  auVar114._4_4_ = fVar120 * auVar12._4_4_;
  auVar114._8_4_ = fVar120 * auVar12._8_4_;
  auVar114._12_4_ = fVar120 * auVar12._12_4_;
  auVar254._0_4_ = fVar120 * auVar241._0_4_;
  auVar254._4_4_ = fVar120 * auVar241._4_4_;
  auVar254._8_4_ = fVar120 * auVar241._8_4_;
  auVar254._12_4_ = fVar120 * auVar241._12_4_;
  auVar241 = vminps_avx(auVar114,auVar254);
  auVar12 = vmaxps_avx(auVar254,auVar114);
  auVar154._0_4_ = fVar85 * auVar234._0_4_;
  auVar154._4_4_ = fVar85 * auVar234._4_4_;
  auVar154._8_4_ = fVar85 * auVar234._8_4_;
  auVar154._12_4_ = fVar85 * auVar234._12_4_;
  auVar213._0_4_ = fVar85 * auVar89._0_4_;
  auVar213._4_4_ = fVar85 * auVar89._4_4_;
  auVar213._8_4_ = fVar85 * auVar89._8_4_;
  auVar213._12_4_ = fVar85 * auVar89._12_4_;
  auVar234 = vminps_avx(auVar154,auVar213);
  auVar255._0_4_ = auVar241._0_4_ + auVar234._0_4_;
  auVar255._4_4_ = auVar241._4_4_ + auVar234._4_4_;
  auVar255._8_4_ = auVar241._8_4_ + auVar234._8_4_;
  auVar255._12_4_ = auVar241._12_4_ + auVar234._12_4_;
  fVar180 = auVar90._0_4_;
  auVar262._0_4_ = fVar180 * auVar107._0_4_;
  fVar194 = auVar90._4_4_;
  auVar262._4_4_ = fVar194 * auVar107._4_4_;
  fVar195 = auVar90._8_4_;
  auVar262._8_4_ = fVar195 * auVar107._8_4_;
  fVar196 = auVar90._12_4_;
  auVar262._12_4_ = fVar196 * auVar107._12_4_;
  auVar241 = vmaxps_avx(auVar213,auVar154);
  auVar214._0_4_ = fVar180 * auVar125._0_4_;
  auVar214._4_4_ = fVar194 * auVar125._4_4_;
  auVar214._8_4_ = fVar195 * auVar125._8_4_;
  auVar214._12_4_ = fVar196 * auVar125._12_4_;
  fVar86 = auVar121._0_4_;
  auVar100._0_4_ = fVar86 * auVar107._0_4_;
  fVar59 = auVar121._4_4_;
  auVar100._4_4_ = fVar59 * auVar107._4_4_;
  fVar145 = auVar121._8_4_;
  auVar100._8_4_ = fVar145 * auVar107._8_4_;
  fVar219 = auVar121._12_4_;
  auVar100._12_4_ = fVar219 * auVar107._12_4_;
  auVar229._0_4_ = fVar86 * auVar125._0_4_;
  auVar229._4_4_ = fVar59 * auVar125._4_4_;
  auVar229._8_4_ = fVar145 * auVar125._8_4_;
  auVar229._12_4_ = fVar219 * auVar125._12_4_;
  auVar115._0_4_ = auVar12._0_4_ + auVar241._0_4_;
  auVar115._4_4_ = auVar12._4_4_ + auVar241._4_4_;
  auVar115._8_4_ = auVar12._8_4_ + auVar241._8_4_;
  auVar115._12_4_ = auVar12._12_4_ + auVar241._12_4_;
  auVar155._8_8_ = 0x3f800000;
  auVar155._0_8_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar155,auVar115);
  auVar241 = vsubps_avx(auVar155,auVar255);
  auVar256._0_4_ = fVar180 * auVar12._0_4_;
  auVar256._4_4_ = fVar194 * auVar12._4_4_;
  auVar256._8_4_ = fVar195 * auVar12._8_4_;
  auVar256._12_4_ = fVar196 * auVar12._12_4_;
  auVar244._0_4_ = fVar180 * auVar241._0_4_;
  auVar244._4_4_ = fVar194 * auVar241._4_4_;
  auVar244._8_4_ = fVar195 * auVar241._8_4_;
  auVar244._12_4_ = fVar196 * auVar241._12_4_;
  auVar116._0_4_ = fVar86 * auVar12._0_4_;
  auVar116._4_4_ = fVar59 * auVar12._4_4_;
  auVar116._8_4_ = fVar145 * auVar12._8_4_;
  auVar116._12_4_ = fVar219 * auVar12._12_4_;
  auVar156._0_4_ = fVar86 * auVar241._0_4_;
  auVar156._4_4_ = fVar59 * auVar241._4_4_;
  auVar156._8_4_ = fVar145 * auVar241._8_4_;
  auVar156._12_4_ = fVar219 * auVar241._12_4_;
  auVar12 = vminps_avx(auVar256,auVar244);
  auVar241 = vminps_avx(auVar116,auVar156);
  auVar12 = vminps_avx(auVar12,auVar241);
  auVar241 = vmaxps_avx(auVar244,auVar256);
  auVar234 = vmaxps_avx(auVar156,auVar116);
  auVar89 = vminps_avx(auVar262,auVar214);
  auVar107 = vminps_avx(auVar100,auVar229);
  auVar89 = vminps_avx(auVar89,auVar107);
  auVar12 = vhaddps_avx(auVar12,auVar89);
  auVar241 = vmaxps_avx(auVar234,auVar241);
  auVar234 = vmaxps_avx(auVar214,auVar262);
  auVar89 = vmaxps_avx(auVar229,auVar100);
  auVar234 = vmaxps_avx(auVar89,auVar234);
  auVar241 = vhaddps_avx(auVar241,auVar234);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar241 = vshufps_avx(auVar241,auVar241,0xe8);
  auVar230._0_4_ = auVar134._0_4_ + auVar12._0_4_;
  auVar230._4_4_ = auVar134._4_4_ + auVar12._4_4_;
  auVar230._8_4_ = auVar134._8_4_ + auVar12._8_4_;
  auVar230._12_4_ = auVar134._12_4_ + auVar12._12_4_;
  auVar215._0_4_ = auVar134._0_4_ + auVar241._0_4_;
  auVar215._4_4_ = auVar134._4_4_ + auVar241._4_4_;
  auVar215._8_4_ = auVar134._8_4_ + auVar241._8_4_;
  auVar215._12_4_ = auVar134._12_4_ + auVar241._12_4_;
  auVar218 = ZEXT1664(auVar215);
  auVar12 = vmaxps_avx(auVar152,auVar230);
  auVar241 = vminps_avx(auVar215,auVar61);
  auVar12 = vcmpps_avx(auVar241,auVar12,1);
  auVar12 = vshufps_avx(auVar12,auVar12,0x50);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar12[0xf] < '\0')
  goto LAB_01181cc2;
  bVar51 = 0;
  if ((auVar193._0_4_ < auVar230._0_4_) && (bVar51 = 0, auVar215._0_4_ < auVar61._0_4_)) {
    auVar241 = vmovshdup_avx(auVar230);
    auVar12 = vcmpps_avx(auVar215,auVar61,1);
    bVar51 = auVar12[4] & auVar60._0_4_ < auVar241._0_4_;
  }
  auVar218 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar54 || fVar58 < 0.001) | bVar51) != 1) goto LAB_01182b20;
  lVar50 = 0xc9;
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_01181cc2;
    fVar59 = auVar134._0_4_;
    fVar86 = 1.0 - fVar59;
    fVar58 = fVar86 * fVar86 * fVar86;
    fVar84 = fVar59 * 3.0 * fVar86 * fVar86;
    fVar86 = fVar86 * fVar59 * fVar59 * 3.0;
    auVar141._4_4_ = fVar58;
    auVar141._0_4_ = fVar58;
    auVar141._8_4_ = fVar58;
    auVar141._12_4_ = fVar58;
    auVar117._4_4_ = fVar84;
    auVar117._0_4_ = fVar84;
    auVar117._8_4_ = fVar84;
    auVar117._12_4_ = fVar84;
    auVar101._4_4_ = fVar86;
    auVar101._0_4_ = fVar86;
    auVar101._8_4_ = fVar86;
    auVar101._12_4_ = fVar86;
    fVar59 = fVar59 * fVar59 * fVar59;
    auVar157._0_4_ = (float)local_218._0_4_ * fVar59;
    auVar157._4_4_ = (float)local_218._4_4_ * fVar59;
    auVar157._8_4_ = fStack_210 * fVar59;
    auVar157._12_4_ = fStack_20c * fVar59;
    auVar10 = vfmadd231ps_fma(auVar157,local_4e8,auVar101);
    auVar10 = vfmadd231ps_fma(auVar10,local_4d8,auVar117);
    auVar10 = vfmadd231ps_fma(auVar10,local_4c8,auVar141);
    auVar102._8_8_ = auVar10._0_8_;
    auVar102._0_8_ = auVar10._0_8_;
    auVar10 = vshufpd_avx(auVar10,auVar10,3);
    auVar12 = vshufps_avx(auVar134,auVar134,0x55);
    auVar10 = vsubps_avx(auVar10,auVar102);
    auVar12 = vfmadd213ps_fma(auVar10,auVar12,auVar102);
    fVar58 = auVar12._0_4_;
    auVar10 = vshufps_avx(auVar12,auVar12,0x55);
    auVar103._0_4_ = fVar120 * fVar58 + fVar85 * auVar10._0_4_;
    auVar103._4_4_ = auVar128._4_4_ * fVar58 + auVar11._4_4_ * auVar10._4_4_;
    auVar103._8_4_ = auVar128._8_4_ * fVar58 + auVar11._8_4_ * auVar10._8_4_;
    auVar103._12_4_ = auVar128._12_4_ * fVar58 + auVar11._12_4_ * auVar10._12_4_;
    auVar134 = vsubps_avx(auVar134,auVar103);
    auVar10 = vandps_avx(local_318,auVar12);
    auVar12 = vshufps_avx(auVar10,auVar10,0xf5);
    auVar10 = vmaxss_avx(auVar12,auVar10);
  } while ((float)local_228._0_4_ <= auVar10._0_4_);
  fVar58 = auVar134._0_4_;
  if ((fVar58 < 0.0) || (1.0 < fVar58)) goto LAB_01181cc2;
  auVar10 = vmovshdup_avx(auVar134);
  fVar84 = auVar10._0_4_;
  if ((fVar84 < 0.0) || (1.0 < fVar84)) goto LAB_01181cc2;
  auVar10 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar234 = vinsertps_avx(auVar10,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar2);
  auVar10 = vdpps_avx(auVar10,auVar234,0x7f);
  auVar12 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar12 = vdpps_avx(auVar12,auVar234,0x7f);
  auVar128 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar128 = vdpps_avx(auVar128,auVar234,0x7f);
  auVar11 = vsubps_avx(local_458,(undefined1  [16])aVar2);
  auVar11 = vdpps_avx(auVar11,auVar234,0x7f);
  auVar241 = vsubps_avx(_local_448,(undefined1  [16])aVar2);
  auVar241 = vdpps_avx(auVar241,auVar234,0x7f);
  auVar152 = vsubps_avx(_local_488,(undefined1  [16])aVar2);
  auVar152 = vdpps_avx(auVar152,auVar234,0x7f);
  auVar61 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar61 = vdpps_avx(auVar61,auVar234,0x7f);
  auVar44._4_4_ = fStack_4a4;
  auVar44._0_4_ = local_4a8;
  auVar44._8_4_ = fStack_4a0;
  auVar44._12_4_ = fStack_49c;
  auVar89 = vsubps_avx(auVar44,(undefined1  [16])aVar2);
  auVar234 = vdpps_avx(auVar89,auVar234,0x7f);
  fVar120 = 1.0 - fVar84;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar241._0_4_ * fVar84)),ZEXT416((uint)fVar120),auVar10)
  ;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar152._0_4_ * fVar84)),ZEXT416((uint)fVar120),auVar12)
  ;
  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar84)),ZEXT416((uint)fVar120),auVar128
                            );
  auVar218 = ZEXT1664(auVar128);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar234._0_4_)),ZEXT416((uint)fVar120),auVar11)
  ;
  fVar86 = 1.0 - fVar58;
  fVar84 = fVar86 * fVar58 * fVar58 * 3.0;
  fVar145 = fVar58 * fVar58 * fVar58;
  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar145)),ZEXT416((uint)fVar84),auVar128
                            );
  fVar120 = fVar58 * 3.0 * fVar86 * fVar86;
  auVar12 = vfmadd231ss_fma(auVar128,ZEXT416((uint)fVar120),auVar12);
  fVar85 = fVar86 * fVar86 * fVar86;
  auVar10 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar85),auVar10);
  fVar59 = auVar10._0_4_;
  if (((fVar59 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
      (fVar219 = (ray->super_RayK<1>).tfar, fVar219 < fVar59)) ||
     (pGVar5 = (context->scene->geometries).items[uVar48].ptr,
     (pGVar5->mask & (ray->super_RayK<1>).mask) == 0)) goto LAB_01181cc2;
  auVar10 = vshufps_avx(auVar134,auVar134,0x55);
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = 0x3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar203,auVar10);
  fVar180 = auVar10._0_4_;
  auVar216._0_4_ = fVar180 * (float)local_448._0_4_;
  fVar194 = auVar10._4_4_;
  auVar216._4_4_ = fVar194 * (float)local_448._4_4_;
  fVar195 = auVar10._8_4_;
  auVar216._8_4_ = fVar195 * fStack_440;
  fVar196 = auVar10._12_4_;
  auVar216._12_4_ = fVar196 * fStack_43c;
  auVar231._0_4_ = fVar180 * (float)local_488._0_4_;
  auVar231._4_4_ = fVar194 * (float)local_488._4_4_;
  auVar231._8_4_ = fVar195 * fStack_480;
  auVar231._12_4_ = fVar196 * fStack_47c;
  auVar237._0_4_ = fVar180 * (float)local_498._0_4_;
  auVar237._4_4_ = fVar194 * (float)local_498._4_4_;
  auVar237._8_4_ = fVar195 * fStack_490;
  auVar237._12_4_ = fVar196 * fStack_48c;
  auVar188._0_4_ = fVar180 * local_4a8;
  auVar188._4_4_ = fVar194 * fStack_4a4;
  auVar188._8_4_ = fVar195 * fStack_4a0;
  auVar188._12_4_ = fVar196 * fStack_49c;
  auVar10 = vfmadd231ps_fma(auVar216,auVar12,local_438);
  auVar128 = vfmadd231ps_fma(auVar231,auVar12,local_468);
  auVar11 = vfmadd231ps_fma(auVar237,auVar12,local_478);
  auVar241 = vfmadd231ps_fma(auVar188,auVar12,local_458);
  auVar10 = vsubps_avx(auVar128,auVar10);
  auVar12 = vsubps_avx(auVar11,auVar128);
  auVar218 = ZEXT1664(auVar12);
  auVar128 = vsubps_avx(auVar241,auVar11);
  auVar238._0_4_ = fVar58 * auVar12._0_4_;
  auVar238._4_4_ = fVar58 * auVar12._4_4_;
  auVar238._8_4_ = fVar58 * auVar12._8_4_;
  auVar238._12_4_ = fVar58 * auVar12._12_4_;
  auVar178._4_4_ = fVar86;
  auVar178._0_4_ = fVar86;
  auVar178._8_4_ = fVar86;
  auVar178._12_4_ = fVar86;
  auVar10 = vfmadd231ps_fma(auVar238,auVar178,auVar10);
  auVar189._0_4_ = fVar58 * auVar128._0_4_;
  auVar189._4_4_ = fVar58 * auVar128._4_4_;
  auVar189._8_4_ = fVar58 * auVar128._8_4_;
  auVar189._12_4_ = fVar58 * auVar128._12_4_;
  auVar128 = vfmadd231ps_fma(auVar189,auVar178,auVar12);
  auVar190._0_4_ = fVar58 * auVar128._0_4_;
  auVar190._4_4_ = fVar58 * auVar128._4_4_;
  auVar190._8_4_ = fVar58 * auVar128._8_4_;
  auVar190._12_4_ = fVar58 * auVar128._12_4_;
  auVar128 = vfmadd231ps_fma(auVar190,auVar178,auVar10);
  auVar158._0_4_ = fVar145 * (float)local_278._0_4_;
  auVar158._4_4_ = fVar145 * (float)local_278._4_4_;
  auVar158._8_4_ = fVar145 * fStack_270;
  auVar158._12_4_ = fVar145 * fStack_26c;
  auVar118._4_4_ = fVar84;
  auVar118._0_4_ = fVar84;
  auVar118._8_4_ = fVar84;
  auVar118._12_4_ = fVar84;
  auVar10 = vfmadd132ps_fma(auVar118,auVar158,local_268);
  auVar142._4_4_ = fVar120;
  auVar142._0_4_ = fVar120;
  auVar142._8_4_ = fVar120;
  auVar142._12_4_ = fVar120;
  auVar10 = vfmadd132ps_fma(auVar142,auVar10,local_258);
  auVar159._0_4_ = auVar128._0_4_ * 3.0;
  auVar159._4_4_ = auVar128._4_4_ * 3.0;
  auVar159._8_4_ = auVar128._8_4_ * 3.0;
  auVar159._12_4_ = auVar128._12_4_ * 3.0;
  auVar131._4_4_ = fVar85;
  auVar131._0_4_ = fVar85;
  auVar131._8_4_ = fVar85;
  auVar131._12_4_ = fVar85;
  auVar128 = vfmadd132ps_fma(auVar131,auVar10,local_248);
  auVar10 = vshufps_avx(auVar159,auVar159,0xc9);
  auVar119._0_4_ = auVar128._0_4_ * auVar10._0_4_;
  auVar119._4_4_ = auVar128._4_4_ * auVar10._4_4_;
  auVar119._8_4_ = auVar128._8_4_ * auVar10._8_4_;
  auVar119._12_4_ = auVar128._12_4_ * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar128 = vfmsub231ps_fma(auVar119,auVar159,auVar10);
  auVar10 = vshufps_avx(auVar128,auVar128,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar59;
    uVar87 = vmovlps_avx(auVar10);
    *(undefined8 *)&(ray->Ng).field_0 = uVar87;
    (ray->Ng).field_0.field_0.z = auVar128._0_4_;
    uVar87 = vmovlps_avx(auVar134);
    ray->u = (float)(int)uVar87;
    ray->v = (float)(int)((ulong)uVar87 >> 0x20);
    ray->primID = (uint)local_4b0;
    ray->geomID = uVar48;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01181cc2;
  }
  local_508._0_4_ = fVar219;
  local_2d8 = vmovlps_avx(auVar10);
  local_2d0 = auVar128._0_4_;
  local_2cc = vmovlps_avx(auVar134);
  local_2c4 = (uint)local_4b0;
  local_2c0 = uVar48;
  local_2bc = context->user->instID[0];
  local_2b8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar59;
  local_50c = -1;
  local_388.valid = &local_50c;
  local_388.geometryUserPtr = pGVar5->userPtr;
  local_388.context = context->user;
  local_388.ray = (RTCRayN *)ray;
  local_388.hit = (RTCHitN *)&local_2d8;
  local_388.N = 1;
  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    auVar218 = ZEXT1664(auVar12);
    (*pGVar5->intersectionFilterN)(&local_388);
    if (*local_388.valid == 0) goto LAB_01182abc;
  }
  p_Var6 = context->args->filter;
  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
    auVar218 = ZEXT1664(auVar218._0_16_);
    (*p_Var6)(&local_388);
    if (*local_388.valid == 0) {
LAB_01182abc:
      (ray->super_RayK<1>).tfar = (float)local_508._0_4_;
      auVar18 = _local_508;
      goto LAB_01181cc2;
    }
  }
  (((Vec3f *)((long)local_388.ray + 0x30))->field_0).components[0] = *(float *)local_388.hit;
  (((Vec3f *)((long)local_388.ray + 0x30))->field_0).field_0.y = *(float *)(local_388.hit + 4);
  (((Vec3f *)((long)local_388.ray + 0x30))->field_0).field_0.z = *(float *)(local_388.hit + 8);
  *(float *)((long)local_388.ray + 0x3c) = *(float *)(local_388.hit + 0xc);
  *(float *)((long)local_388.ray + 0x40) = *(float *)(local_388.hit + 0x10);
  *(float *)((long)local_388.ray + 0x44) = *(float *)(local_388.hit + 0x14);
  *(float *)((long)local_388.ray + 0x48) = *(float *)(local_388.hit + 0x18);
  *(float *)((long)local_388.ray + 0x4c) = *(float *)(local_388.hit + 0x1c);
  *(float *)((long)local_388.ray + 0x50) = *(float *)(local_388.hit + 0x20);
  auVar18 = _local_508;
  goto LAB_01181cc2;
LAB_01182b20:
  local_238 = vinsertps_avx(auVar10,ZEXT416((uint)fVar84),0x10);
  auVar68 = vinsertps_avx(auVar60,ZEXT416((uint)auVar88._0_4_),0x10);
  goto LAB_01181713;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }